

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void crash_recovery_test(bool walflush)

{
  fdb_encryption_key *__s;
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  undefined8 doc;
  hbtrie **pphVar4;
  fdb_status fVar5;
  int iVar6;
  fdb_status fVar7;
  fdb_status extraout_EAX;
  fdb_file_handle **ptr_fhandle;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  fdb_doc *fconfig_00;
  fdb_kvs_config *config;
  fdb_config *pfVar11;
  fdb_kvs_handle *pfVar12;
  __atomic_base<unsigned_long> handle;
  __atomic_base<unsigned_long> _Var13;
  char *handle_00;
  fdb_iterator *doc_00;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  char *in_RCX;
  char *pcVar16;
  btree *extraout_RDX;
  fdb_kvs_handle *pfVar17;
  long lVar18;
  hbtrie **seqnum;
  fdb_kvs_handle *doc_01;
  uint uVar19;
  size_t unaff_RBP;
  fdb_doc *__s_00;
  long lVar20;
  char *pcVar21;
  undefined7 in_register_00000039;
  fdb_file_handle *fhandle;
  fdb_iterator *pfVar22;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *pfVar23;
  char *unaff_R13;
  ulong uVar24;
  fdb_doc *pfVar25;
  fdb_doc **ppfVar26;
  fdb_doc *pfVar27;
  char *pcVar28;
  btree *__s_01;
  fdb_iterator *config_00;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_2b70;
  fdb_iterator *pfStack_2b68;
  int iStack_2b5c;
  fdb_kvs_handle *pfStack_2b58;
  timeval tStack_2b50;
  fdb_kvs_handle *pfStack_2b40;
  fdb_kvs_handle *pfStack_2b38;
  fdb_kvs_handle *pfStack_2b30;
  fdb_kvs_handle *pfStack_2b28;
  fdb_iterator *pfStack_2b20;
  fdb_iterator *pfStack_2b18;
  fdb_kvs_handle *pfStack_2b08;
  fdb_kvs_handle *pfStack_2b00;
  undefined1 auStack_2af8 [24];
  fdb_kvs_handle *pfStack_2ae0;
  fdb_kvs_handle *pfStack_2ad8;
  fdb_kvs_handle *pfStack_2ad0;
  fdb_kvs_handle *pfStack_2ac8;
  undefined1 auStack_2ac0 [80];
  undefined8 auStack_2a70 [5];
  fdb_doc *apfStack_2a48 [6];
  fdb_kvs_info fStack_2a18;
  timeval tStack_29e8;
  undefined1 auStack_29d8 [280];
  fdb_iterator fStack_28c0;
  fdb_kvs_handle fStack_27c0;
  fdb_kvs_handle *pfStack_25b8;
  btree *pbStack_25b0;
  fdb_kvs_handle *pfStack_25a8;
  code *pcStack_25a0;
  fdb_iterator *pfStack_2590;
  fdb_kvs_handle *pfStack_2588;
  fdb_kvs_handle *pfStack_2580;
  fdb_kvs_handle *pfStack_2578;
  atomic<unsigned_long> *paStack_2570;
  size_t sStack_2568;
  fdb_kvs_handle *pfStack_2560;
  fdb_kvs_info fStack_2558;
  undefined1 auStack_2528 [14];
  undefined2 uStack_251a;
  undefined1 auStack_2518 [520];
  fdb_kvs_handle *pfStack_2310;
  fdb_kvs_handle *pfStack_2308;
  fdb_kvs_handle *pfStack_2300;
  fdb_kvs_handle *pfStack_22f8;
  fdb_kvs_handle *pfStack_22f0;
  fdb_kvs_handle *pfStack_22e8;
  undefined1 auStack_22d8 [8];
  fdb_file_handle *pfStack_22d0;
  fdb_kvs_handle *pfStack_22c8;
  fdb_kvs_handle *pfStack_22c0;
  fdb_iterator *pfStack_22b8;
  undefined1 auStack_22b0 [48];
  undefined1 auStack_2280 [64];
  hbtrie *phStack_2240;
  kvs_ops_stat *pkStack_2238;
  timeval tStack_2210;
  btreeblk_handle *apbStack_2200 [33];
  undefined1 auStack_20f8 [32];
  undefined2 uStack_20d8;
  undefined1 uStack_20b8;
  code *pcStack_20a0;
  undefined4 uStack_2098;
  fdb_txn *pfStack_2090;
  fdb_kvs_handle *pfStack_2000;
  char acStack_1ff8 [256];
  fdb_kvs_handle *pfStack_1ef8;
  fdb_kvs_handle *pfStack_1ef0;
  fdb_kvs_handle *pfStack_1ee8;
  fdb_kvs_handle *pfStack_1ee0;
  fdb_kvs_handle *pfStack_1ed8;
  fdb_kvs_handle *pfStack_1ed0;
  fdb_kvs_handle *pfStack_1ec0;
  uint uStack_1eb4;
  fdb_iterator *pfStack_1eb0;
  fdb_kvs_handle *pfStack_1ea8;
  undefined4 *puStack_1ea0;
  fdb_kvs_handle *pfStack_1e98;
  fdb_kvs_handle *pfStack_1e90;
  fdb_iterator *pfStack_1e88;
  fdb_file_handle *pfStack_1e80;
  fdb_iterator *pfStack_1e78;
  size_t sStack_1e70;
  undefined1 auStack_1e68 [32];
  timeval tStack_1e48;
  undefined1 auStack_1e38 [272];
  size_t sStack_1d28;
  char *pcStack_1d20;
  uint8_t uStack_1d18;
  undefined2 uStack_1d10;
  undefined1 uStack_1cf0;
  fdb_kvs_handle *pfStack_1c38;
  char acStack_1c30 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_1b30;
  fdb_kvs_handle *pfStack_1b28;
  fdb_kvs_handle *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b18;
  fdb_kvs_handle *pfStack_1b10;
  fdb_kvs_handle *pfStack_1b08;
  fdb_kvs_handle *pfStack_1af8;
  fdb_file_handle *pfStack_1af0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1ae8;
  fdb_doc *pfStack_1ae0;
  fdb_kvs_handle *pfStack_1ad8;
  fdb_kvs_handle *pfStack_1ad0;
  fdb_kvs_handle *pfStack_1ac8;
  fdb_kvs_handle *pfStack_1ac0;
  fdb_kvs_handle *pfStack_1ab8;
  fdb_kvs_handle *pfStack_1ab0;
  fdb_kvs_config fStack_1aa8;
  fdb_kvs_config fStack_1a90;
  fdb_kvs_config fStack_1a70;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1a50 [4];
  timeval tStack_1a30;
  fdb_config fStack_1a20;
  fdb_kvs_info *pfStack_1908;
  atomic<unsigned_long> aStack_1900;
  fdb_kvs_handle *pfStack_18f8;
  atomic<unsigned_long> aStack_18f0;
  fdb_kvs_handle *pfStack_18e8;
  atomic<unsigned_long> aStack_18e0;
  fdb_kvs_handle *pfStack_18d0;
  fdb_kvs_handle *pfStack_18c8;
  fdb_file_handle *pfStack_18c0;
  undefined1 auStack_18b8 [16];
  fdb_config *pfStack_18a8;
  fdb_kvs_info fStack_18a0;
  fdb_kvs_config fStack_1870;
  undefined1 auStack_1858 [176];
  char acStack_17a8 [256];
  undefined1 auStack_16a8 [512];
  fdb_config fStack_14a8;
  fdb_kvs_handle *pfStack_13b0;
  fdb_kvs_handle *pfStack_13a8;
  fdb_kvs_handle *pfStack_13a0;
  fdb_kvs_handle *pfStack_1398;
  fdb_kvs_handle *pfStack_1390;
  fdb_kvs_handle *pfStack_1388;
  fdb_kvs_handle *pfStack_1380;
  fdb_kvs_handle *pfStack_1378;
  fdb_kvs_handle *pfStack_1370;
  fdb_kvs_handle *pfStack_1368;
  fdb_file_handle *pfStack_1360;
  undefined4 *puStack_1358;
  undefined1 auStack_1350 [48];
  fdb_kvs_handle *pfStack_1320;
  undefined1 auStack_1318 [40];
  undefined1 auStack_12f0 [272];
  size_t sStack_11e0;
  uint8_t uStack_11d0;
  undefined1 uStack_11c8;
  undefined1 uStack_11a8;
  fdb_kvs_handle *pfStack_10f0;
  char acStack_10e8 [256];
  hbtrie **pphStack_fe8;
  fdb_kvs_handle *pfStack_fe0;
  fdb_kvs_handle *pfStack_fd8;
  fdb_config *pfStack_fd0;
  fdb_kvs_handle *pfStack_fc8;
  fdb_kvs_handle *pfStack_fc0;
  fdb_kvs_handle *pfStack_fa8;
  hbtrie *phStack_fa0;
  undefined1 auStack_f98 [16];
  hbtrie **pphStack_f88;
  kvs_info *apkStack_f80 [3];
  hbtrie *phStack_f68;
  timeval tStack_f60;
  undefined1 auStack_f50 [184];
  char acStack_e98 [256];
  undefined1 auStack_d98 [520];
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined4 uStack_b74;
  undefined1 uStack_b69;
  fdb_doc *pfStack_aa0;
  fdb_kvs_handle *pfStack_a98;
  fdb_kvs_handle *pfStack_a90;
  fdb_doc *pfStack_a88;
  fdb_kvs_config *pfStack_a80;
  fdb_doc *pfStack_a78;
  fdb_kvs_handle *pfStack_a68;
  undefined1 auStack_a60 [16];
  fdb_kvs_handle *pfStack_a50;
  undefined1 auStack_a48 [24];
  fdb_doc *pfStack_a30;
  undefined1 auStack_a08 [64];
  fdb_doc *apfStack_9c8 [4];
  fdb_doc *pfStack_9a8;
  fdb_doc *apfStack_9a0 [5];
  fdb_doc *apfStack_978 [5];
  timeval tStack_950;
  char acStack_940 [256];
  fdb_doc afStack_840 [3];
  fdb_kvs_handle fStack_740;
  fdb_kvs_handle *pfStack_538;
  fdb_doc *pfStack_530;
  fdb_file_handle **ppfStack_528;
  code *pcStack_520;
  undefined1 local_510 [28];
  undefined4 local_4f4;
  undefined1 local_4f0 [104];
  timeval local_488;
  fdb_file_info local_478;
  fdb_config local_430;
  char local_338 [256];
  fdb_kvs_handle local_238;
  
  local_4f4 = (undefined4)CONCAT71(in_register_00000039,walflush);
  pcStack_520 = (code *)0x11036e;
  gettimeofday(&local_488,(__timezone_ptr_t)0x0);
  pcStack_520 = (code *)0x110373;
  memleak_start();
  pcStack_520 = (code *)0x11037f;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_520 = (code *)0x11038f;
  fdb_get_default_config();
  pfVar25 = (fdb_doc *)local_4f0;
  pcStack_520 = (code *)0x11039c;
  fdb_get_default_kvs_config();
  local_430.buffercache_size = 0;
  local_430.seqtree_opt = '\x01';
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.compaction_threshold = '\0';
  ptr_fhandle = (fdb_file_handle **)(local_510 + 8);
  pcStack_520 = (code *)0x1103d2;
  fdb_open(ptr_fhandle,"./mvcc_test2",&local_430);
  pfVar17 = (fdb_kvs_handle *)local_510;
  pcStack_520 = (code *)0x1103e5;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_510._8_8_,(fdb_kvs_handle **)pfVar17,(fdb_kvs_config *)pfVar25
            );
  pcStack_520 = (code *)0x1103fb;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_510._0_8_,logCallbackFunc,"crash_recovery_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R13 = (char *)0x0;
    uVar24 = 0;
    do {
      __s = &local_238.config.encryption_key;
      pcStack_520 = (code *)0x110425;
      sprintf((char *)__s,"key%d",uVar24 & 0xffffffff);
      pcStack_520 = (code *)0x11043e;
      sprintf((char *)&local_238,"meta%d",uVar24 & 0xffffffff);
      pcStack_520 = (code *)0x110457;
      sprintf(local_338,"body%d",uVar24 & 0xffffffff);
      unaff_R12 = (fdb_kvs_handle *)(local_4f0 + (long)unaff_R13 + 0x18);
      pcStack_520 = (code *)0x110467;
      unaff_RBP = strlen((char *)__s);
      pfVar17 = &local_238;
      pcStack_520 = (code *)0x11047a;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar17);
      pcStack_520 = (code *)0x11048a;
      sVar8 = strlen(local_338);
      pcStack_520 = (code *)0x1104af;
      in_RCX = (char *)pfVar17;
      fdb_doc_create((fdb_doc **)unaff_R12,&local_238.config.encryption_key,unaff_RBP,pfVar17,
                     (size_t)ptr_fhandle,local_338,sVar8);
      pcStack_520 = (code *)0x1104be;
      fdb_set((fdb_kvs_handle *)local_510._0_8_,*(fdb_doc **)(local_4f0 + uVar24 * 8 + 0x18));
      uVar24 = uVar24 + 1;
      unaff_R13 = (char *)((long)unaff_R13 + 8);
    } while (uVar24 != 10);
    pfVar25 = (fdb_doc *)0xa;
    fhandle = (fdb_file_handle *)local_510._8_8_;
    if ((char)local_4f4 != '\0') {
      pcStack_520 = (code *)0x1104e5;
      fVar5 = fdb_commit((fdb_file_handle *)local_510._8_8_,'\x01');
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pcStack_520 = (code *)0x1104ee;
        crash_recovery_test();
        goto LAB_001104ee;
      }
LAB_001104fd:
      pcStack_520 = (code *)0x11050f;
      fVar5 = fdb_get_file_info((fdb_file_handle *)local_510._8_8_,&local_478);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110783;
      uVar24 = (ulong)local_430.blocksize;
      pcStack_520 = (code *)0x110538;
      fdb_kvs_close((fdb_kvs_handle *)local_510._0_8_);
      pcStack_520 = (code *)0x110542;
      fdb_close((fdb_file_handle *)local_510._8_8_);
      pcStack_520 = (code *)0x110547;
      fdb_shutdown();
      pfVar17 = (fdb_kvs_handle *)((local_478.file_size / uVar24) * (ulong)local_430.blocksize);
      in_RCX = (char *)(ulong)(local_430.blocksize >> 2);
      pcStack_520 = (code *)0x110569;
      iVar6 = _disk_dump("./mvcc_test2",(size_t)pfVar17,
                         (ulong)((local_430.blocksize >> 2) + local_430.blocksize * 2));
      if (iVar6 < 0) goto LAB_00110788;
      pcStack_520 = (code *)0x11058a;
      fVar5 = fdb_open((fdb_file_handle **)(local_510 + 8),"./mvcc_test2",&local_430);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011078d;
      pcStack_520 = (code *)0x1105a6;
      fVar5 = fdb_kvs_open_default
                        ((fdb_file_handle *)local_510._8_8_,(fdb_kvs_handle **)local_510,
                         (fdb_kvs_config *)local_4f0);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110792;
      pcStack_520 = (code *)0x1105c6;
      fVar5 = fdb_set_log_callback
                        ((fdb_kvs_handle *)local_510._0_8_,logCallbackFunc,"crash_recovery_test");
      if (fVar5 == FDB_RESULT_SUCCESS) {
        unaff_R13 = (char *)0x0;
        do {
          in_RCX = (char *)0x0;
          pcStack_520 = (code *)0x1105fa;
          fdb_doc_create((fdb_doc **)(local_510 + 0x10),
                         (void *)(*(size_t **)(local_4f0 + (long)unaff_R13 * 8 + 0x18))[4],
                         **(size_t **)(local_4f0 + (long)unaff_R13 * 8 + 0x18),(void *)0x0,0,
                         (void *)0x0,0);
          pcStack_520 = (code *)0x110609;
          fVar5 = fdb_get((fdb_kvs_handle *)local_510._0_8_,(fdb_doc *)local_510._16_8_);
          doc = local_510._16_8_;
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pcStack_520 = (code *)0x110763;
            crash_recovery_test();
LAB_00110763:
            pcStack_520 = (code *)0x11076e;
            crash_recovery_test();
LAB_0011076e:
            pcStack_520 = (code *)0x110779;
            crash_recovery_test();
            goto LAB_00110779;
          }
          ptr_fhandle = *(fdb_file_handle ***)(local_510._16_8_ + 0x38);
          unaff_RBP = *(size_t *)(local_4f0 + (long)unaff_R13 * 8 + 0x18);
          unaff_R12 = *(fdb_kvs_handle **)(unaff_RBP + 0x38);
          pcStack_520 = (code *)0x110632;
          iVar6 = bcmp(ptr_fhandle,unaff_R12,*(size_t *)(local_510._16_8_ + 8));
          pfVar25 = (fdb_doc *)doc;
          if (iVar6 != 0) goto LAB_00110763;
          ptr_fhandle = *(fdb_file_handle ***)(doc + 0x40);
          unaff_R12 = *(fdb_kvs_handle **)(unaff_RBP + 0x40);
          pcStack_520 = (code *)0x110651;
          iVar6 = bcmp(ptr_fhandle,unaff_R12,*(size_t *)(doc + 0x10));
          if (iVar6 != 0) goto LAB_0011076e;
          pcStack_520 = (code *)0x110661;
          fdb_doc_free((fdb_doc *)doc);
          unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
        } while (unaff_R13 != (undefined1 *)0xa);
        pfVar25 = (fdb_doc *)0x1;
        while( true ) {
          in_RCX = (char *)0x0;
          pcStack_520 = (code *)0x110695;
          fdb_doc_create((fdb_doc **)(local_510 + 0x10),(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
          *(fdb_doc **)(local_510._16_8_ + 0x28) = pfVar25;
          pcStack_520 = (code *)0x1106a8;
          fVar5 = fdb_get_byseq((fdb_kvs_handle *)local_510._0_8_,(fdb_doc *)local_510._16_8_);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
          pcStack_520 = (code *)0x1106ba;
          fdb_doc_free((fdb_doc *)local_510._16_8_);
          pfVar25 = (fdb_doc *)((long)&pfVar25->keylen + 1);
          if (pfVar25 == (fdb_doc *)0xb) {
            lVar18 = 0;
            do {
              pcStack_520 = (code *)0x1106cf;
              fdb_doc_free(*(fdb_doc **)(local_4f0 + lVar18 * 8 + 0x18));
              lVar18 = lVar18 + 1;
            } while (lVar18 != 10);
            pcStack_520 = (code *)0x1106e2;
            fdb_kvs_close((fdb_kvs_handle *)local_510._0_8_);
            pcStack_520 = (code *)0x1106ec;
            fdb_close((fdb_file_handle *)local_510._8_8_);
            pcStack_520 = (code *)0x1106f1;
            fdb_shutdown();
            pcStack_520 = (code *)0x1106f6;
            memleak_end();
            if ((char)local_4f4 == '\0') {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                pcVar21 = "%s PASSED\n";
              }
              else {
                pcVar21 = "%s FAILED\n";
              }
              pcVar16 = "crash recovery test - normal flush";
            }
            else {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                pcVar21 = "%s PASSED\n";
              }
              else {
                pcVar21 = "%s FAILED\n";
              }
              pcVar16 = "crash recovery test - walflush";
            }
            pcStack_520 = (code *)0x11074c;
            fprintf(_stderr,pcVar21,pcVar16);
            return;
          }
        }
LAB_00110779:
        pfVar17 = (fdb_kvs_handle *)(local_510 + 0x10);
        pcStack_520 = (code *)0x11077e;
        crash_recovery_test();
        goto LAB_0011077e;
      }
      goto LAB_00110797;
    }
LAB_001104ee:
    pcStack_520 = (code *)0x1104f5;
    fVar5 = fdb_commit(fhandle,'\0');
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001104fd;
  }
  else {
LAB_0011077e:
    pcStack_520 = (code *)0x110783;
    crash_recovery_test();
LAB_00110783:
    pcStack_520 = (code *)0x110788;
    crash_recovery_test();
LAB_00110788:
    pcStack_520 = (code *)0x11078d;
    crash_recovery_test();
LAB_0011078d:
    pcStack_520 = (code *)0x110792;
    crash_recovery_test();
LAB_00110792:
    pcStack_520 = (code *)0x110797;
    crash_recovery_test();
LAB_00110797:
    pcStack_520 = (code *)0x11079c;
    crash_recovery_test();
  }
  pcStack_520 = snapshot_test;
  crash_recovery_test();
  pcVar21 = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x1107c4;
  fStack_740.bub_ctx.space_used = (uint64_t)pfVar17;
  fStack_740.bub_ctx.handle = unaff_R12;
  pfStack_538 = (fdb_kvs_handle *)unaff_R13;
  pfStack_530 = pfVar25;
  ppfStack_528 = ptr_fhandle;
  pcStack_520 = (code *)unaff_RBP;
  gettimeofday((timeval *)(apfStack_978 + 5),(__timezone_ptr_t)0x0);
  pfStack_a78 = (fdb_doc *)0x1107c9;
  memleak_start();
  auStack_a48._0_8_ = (fdb_doc *)0x0;
  pfStack_a78 = (fdb_doc *)0x1107dd;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = (fdb_doc *)&fStack_740.config.encryption_key;
  pfStack_a78 = (fdb_doc *)0x1107ed;
  fdb_get_default_config();
  config = (fdb_kvs_config *)auStack_a08;
  pfStack_a78 = (fdb_doc *)0x1107fa;
  fdb_get_default_kvs_config();
  fStack_740.config.encryption_key.bytes[4] = '\0';
  fStack_740.config.encryption_key.bytes[5] = '\0';
  fStack_740.config.encryption_key.bytes[6] = '\0';
  fStack_740.config.encryption_key.bytes[7] = '\0';
  fStack_740.config.encryption_key.bytes[8] = '\0';
  fStack_740.config.encryption_key.bytes[9] = '\0';
  fStack_740.config.encryption_key.bytes[10] = '\0';
  fStack_740.config.encryption_key.bytes[0xb] = '\0';
  fStack_740.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_740.config.encryption_key.bytes[0xc] = '\0';
  fStack_740.config.encryption_key.bytes[0xd] = '\x04';
  fStack_740.config.encryption_key.bytes[0xe] = '\0';
  fStack_740.config.encryption_key.bytes[0xf] = '\0';
  fStack_740.config.encryption_key.bytes[0x10] = '\0';
  fStack_740.config.encryption_key.bytes[0x11] = '\0';
  fStack_740.config.encryption_key.bytes[0x12] = '\0';
  fStack_740.config.encryption_key.bytes[0x13] = '\0';
  fStack_740.config._180_4_ = 1;
  fStack_740.config.block_reusing_threshold._7_1_ = 0;
  pfStack_a78 = (fdb_doc *)0x110820;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar25 = (fdb_doc *)(auStack_a60 + 8);
  pfStack_a78 = (fdb_doc *)0x110837;
  fVar5 = fdb_open((fdb_file_handle **)pfVar25,"./mvcc_test1",(fdb_config *)fconfig_00);
  __s_00 = (fdb_doc *)(ulong)(uint)fVar5;
  pfStack_a78 = (fdb_doc *)0x110849;
  fdb_kvs_open_default((fdb_file_handle *)auStack_a60._8_8_,&pfStack_a68,config);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011123c;
  pfStack_a78 = (fdb_doc *)0x110862;
  fVar5 = fdb_snapshot_open(pfStack_a68,&pfStack_a50,0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111241;
  pfStack_a78 = (fdb_doc *)0x110879;
  fdb_get_kvs_info(pfStack_a50,(fdb_kvs_info *)(auStack_a48 + 0x10));
  if (pfStack_a30 != (fdb_doc *)0x0) {
    pfStack_a78 = (fdb_doc *)0x110889;
    snapshot_test();
  }
  pfVar25 = (fdb_doc *)auStack_a60;
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x1108ac;
  fdb_iterator_init(pfStack_a50,(fdb_iterator **)pfVar25,(void *)0x0,0,(void *)0x0,0,0);
  pfStack_a78 = (fdb_doc *)0x1108b9;
  fVar5 = fdb_iterator_get((fdb_iterator *)auStack_a60._0_8_,(fdb_doc **)auStack_a48);
  if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00111246;
  pfStack_a78 = (fdb_doc *)0x1108cc;
  fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  pfStack_a78 = (fdb_doc *)0x1108d6;
  fdb_kvs_close(pfStack_a50);
  lVar18 = 0;
  uVar24 = 0;
  do {
    pfStack_a78 = (fdb_doc *)0x1108f6;
    sprintf(acStack_940,"key%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x11090e;
    sprintf((char *)&fStack_740,"meta%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110926;
    sprintf((char *)afStack_840,"body%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110939;
    sVar8 = strlen(acStack_940);
    pfStack_a78 = (fdb_doc *)0x11094c;
    sVar9 = strlen((char *)&fStack_740);
    pfStack_a78 = (fdb_doc *)0x11095c;
    sVar10 = strlen((char *)afStack_840);
    pfStack_a78 = (fdb_doc *)0x110981;
    fdb_doc_create((fdb_doc **)(auStack_a08 + lVar18 + 0x18),acStack_940,sVar8,&fStack_740,sVar9,
                   afStack_840,sVar10);
    pfStack_a78 = (fdb_doc *)0x110993;
    fdb_set(pfStack_a68,apfStack_9c8[uVar24 - 5]);
    uVar24 = uVar24 + 1;
    lVar18 = lVar18 + 8;
  } while (uVar24 != 5);
  pfStack_a78 = (fdb_doc *)0x1109b3;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\x01');
  uVar24 = 5;
  ppfVar26 = apfStack_9c8;
  do {
    pfStack_a78 = (fdb_doc *)0x1109db;
    sprintf(acStack_940,"key%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x1109f6;
    sprintf((char *)&fStack_740,"meta%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110a11;
    sprintf((char *)afStack_840,"body%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110a19;
    sVar8 = strlen(acStack_940);
    pfStack_a78 = (fdb_doc *)0x110a24;
    sVar9 = strlen((char *)&fStack_740);
    pfStack_a78 = (fdb_doc *)0x110a2f;
    sVar10 = strlen((char *)afStack_840);
    pfStack_a78 = (fdb_doc *)0x110a4f;
    fdb_doc_create(ppfVar26,acStack_940,sVar8,&fStack_740,sVar9,afStack_840,sVar10);
    pfStack_a78 = (fdb_doc *)0x110a5c;
    fdb_set(pfStack_a68,*ppfVar26);
    uVar24 = uVar24 + 1;
    ppfVar26 = ppfVar26 + 1;
  } while (uVar24 != 9);
  pfStack_a78 = (fdb_doc *)0x110a8b;
  sprintf(acStack_940,"key%d",9);
  pfStack_a78 = (fdb_doc *)0x110aa9;
  sprintf((char *)&fStack_740,"meta%d",9);
  pfStack_a78 = (fdb_doc *)0x110ac7;
  sprintf((char *)afStack_840,"Body%d",9);
  pfStack_a78 = (fdb_doc *)0x110ad7;
  sVar8 = strlen(acStack_940);
  pfStack_a78 = (fdb_doc *)0x110ae2;
  sVar9 = strlen((char *)&fStack_740);
  pfStack_a78 = (fdb_doc *)0x110aed;
  sVar10 = strlen((char *)afStack_840);
  pfStack_a78 = (fdb_doc *)0x110b08;
  fdb_doc_create(&pfStack_9a8,acStack_940,sVar8,&fStack_740,sVar9,afStack_840,sVar10);
  pfStack_a78 = (fdb_doc *)0x110b16;
  fdb_set(pfStack_a68,pfStack_9a8);
  pfStack_a78 = (fdb_doc *)0x110b22;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  *(undefined1 *)pfStack_9a8->body = 0x62;
  pfStack_a78 = (fdb_doc *)0x110b3b;
  fdb_set(pfStack_a68,pfStack_9a8);
  pfStack_a78 = (fdb_doc *)0x110b47;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  auStack_a48._8_8_ = pfStack_9a8->seqnum;
  pfStack_a78 = (fdb_doc *)0x110b5e;
  fdb_set(pfStack_a68,pfStack_9a8);
  pfStack_a78 = (fdb_doc *)0x110b6a;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  uVar24 = 10;
  unaff_R13 = (char *)0x50;
  do {
    pfStack_a78 = (fdb_doc *)0x110b90;
    sprintf(acStack_940,"key%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110bab;
    sprintf((char *)&fStack_740,"meta%d",uVar24 & 0xffffffff);
    __s_00 = afStack_840;
    pfStack_a78 = (fdb_doc *)0x110bc6;
    sprintf((char *)__s_00,"body%d",uVar24 & 0xffffffff);
    pcVar21 = auStack_a08 + (long)unaff_R13 + 0x18;
    pfStack_a78 = (fdb_doc *)0x110bd9;
    fconfig_00 = (fdb_doc *)strlen(acStack_940);
    pfStack_a78 = (fdb_doc *)0x110be4;
    config = (fdb_kvs_config *)strlen((char *)&fStack_740);
    pfStack_a78 = (fdb_doc *)0x110bef;
    sVar8 = strlen((char *)__s_00);
    in_RCX = (char *)&fStack_740;
    pfStack_a78 = (fdb_doc *)0x110c14;
    fdb_doc_create((fdb_doc **)pcVar21,acStack_940,(size_t)fconfig_00,in_RCX,(size_t)config,__s_00,
                   sVar8);
    pfStack_a78 = (fdb_doc *)0x110c26;
    fdb_set(pfStack_a68,apfStack_9c8[uVar24 - 5]);
    uVar24 = uVar24 + 1;
    unaff_R13 = (char *)((long)unaff_R13 + 8);
  } while (uVar24 != 0xf);
  pfStack_a78 = (fdb_doc *)0x110c46;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\x01');
  pfStack_a78 = (fdb_doc *)0x110c5e;
  fVar5 = fdb_set_log_callback(pfStack_a68,logCallbackFunc,"snapshot_test");
  pfVar25 = (fdb_doc *)0xf;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011124b;
  pfStack_a78 = (fdb_doc *)0x110c7a;
  fVar5 = fdb_snapshot_open(pfStack_a68,&pfStack_a50,999999);
  fconfig_00 = (fdb_doc *)auStack_a48._8_8_;
  if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00111250;
  pfStack_a78 = (fdb_doc *)0x110c9a;
  fVar5 = fdb_snapshot_open(pfStack_a68,&pfStack_a50,auStack_a48._8_8_);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111255;
  pfStack_a78 = (fdb_doc *)0x110cb4;
  fdb_get_kvs_info(pfStack_a50,(fdb_kvs_info *)(auStack_a48 + 0x10));
  if (pfStack_a30 != fconfig_00) {
    pfStack_a78 = (fdb_doc *)0x110cc7;
    snapshot_test();
  }
  uVar24 = 0xf;
  pfVar27 = (fdb_doc *)apfStack_978;
  do {
    pfStack_a78 = (fdb_doc *)0x110cef;
    sprintf(acStack_940,"key%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110d0a;
    sprintf((char *)&fStack_740,"meta%d",uVar24 & 0xffffffff);
    __s_00 = afStack_840;
    pfStack_a78 = (fdb_doc *)0x110d25;
    sprintf((char *)__s_00,"body%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110d2d;
    config = (fdb_kvs_config *)strlen(acStack_940);
    pfStack_a78 = (fdb_doc *)0x110d38;
    pcVar21 = (char *)strlen((char *)&fStack_740);
    pfStack_a78 = (fdb_doc *)0x110d43;
    sVar8 = strlen((char *)__s_00);
    pfStack_a78 = (fdb_doc *)0x110d63;
    fdb_doc_create((fdb_doc **)pfVar27,acStack_940,(size_t)config,&fStack_740,(size_t)pcVar21,__s_00
                   ,sVar8);
    pfStack_a78 = (fdb_doc *)0x110d70;
    fdb_set(pfStack_a68,*(fdb_doc **)pfVar27);
    uVar24 = uVar24 + 1;
    pfVar27 = (fdb_doc *)((long)pfVar27 + 8);
  } while (uVar24 != 0x14);
  unaff_R13 = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x110d90;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x110db0;
  fdb_iterator_init(pfStack_a50,(fdb_iterator **)auStack_a60,(void *)0x0,0,(void *)0x0,0,0);
  pfVar25 = (fdb_doc *)auStack_a48;
  do {
    pfStack_a78 = (fdb_doc *)0x110dc2;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_a60._0_8_,(fdb_doc **)pfVar25);
    fconfig_00 = (fdb_doc *)auStack_a48._0_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_001111fb:
      pfStack_a78 = (fdb_doc *)0x111200;
      snapshot_test();
      fconfig_00 = pfVar27;
LAB_00111200:
      pfStack_a78 = (fdb_doc *)0x11120b;
      snapshot_test();
LAB_0011120b:
      pfStack_a78 = (fdb_doc *)0x111216;
      snapshot_test();
      goto LAB_00111216;
    }
    config = *(fdb_kvs_config **)(auStack_a48._0_8_ + 0x20);
    __s_00 = apfStack_9c8
             [(long)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 3)];
    pcVar21 = (char *)__s_00->key;
    pfStack_a78 = (fdb_doc *)0x110ded;
    iVar6 = bcmp(config,pcVar21,*(size_t *)auStack_a48._0_8_);
    pfVar27 = fconfig_00;
    if (iVar6 != 0) {
      pfStack_a78 = (fdb_doc *)0x1111fb;
      snapshot_test();
      goto LAB_001111fb;
    }
    config = *(fdb_kvs_config **)((long)fconfig_00 + 0x38);
    pcVar21 = (char *)__s_00->meta;
    pfStack_a78 = (fdb_doc *)0x110e0c;
    iVar6 = bcmp(config,pcVar21,*(size_t *)((long)fconfig_00 + 8));
    if (iVar6 != 0) goto LAB_0011120b;
    config = *(fdb_kvs_config **)((long)fconfig_00 + 0x40);
    pcVar21 = (char *)__s_00->body;
    pfStack_a78 = (fdb_doc *)0x110e2b;
    iVar6 = bcmp(config,pcVar21,*(size_t *)((long)fconfig_00 + 0x10));
    if (iVar6 != 0) goto LAB_00111200;
    pfStack_a78 = (fdb_doc *)0x110e3b;
    fdb_doc_free(fconfig_00);
    auStack_a48._0_8_ = (fdb_doc *)0x0;
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    pfStack_a78 = (fdb_doc *)0x110e51;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_a60._0_8_);
  } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
  if ((int)unaff_R13 != 10) goto LAB_0011125a;
  pfStack_a78 = (fdb_doc *)0x110e71;
  fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  unaff_R13 = (char *)0x0;
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x110e88;
  fdb_iterator_sequence_init(pfStack_a50,(fdb_iterator **)auStack_a60,0,0,0);
  pfVar25 = (fdb_doc *)auStack_a48;
  do {
    pfStack_a78 = (fdb_doc *)0x110e9a;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_a60._0_8_,(fdb_doc **)pfVar25);
    fconfig_00 = (fdb_doc *)auStack_a48._0_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111221;
    config = *(fdb_kvs_config **)(auStack_a48._0_8_ + 0x20);
    __s_00 = apfStack_9c8
             [(long)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 3)];
    pcVar21 = (char *)__s_00->key;
    pfStack_a78 = (fdb_doc *)0x110ec5;
    iVar6 = bcmp(config,pcVar21,*(size_t *)auStack_a48._0_8_);
    if (iVar6 != 0) goto LAB_00111216;
    config = *(fdb_kvs_config **)((long)fconfig_00 + 0x38);
    pcVar21 = (char *)__s_00->meta;
    pfStack_a78 = (fdb_doc *)0x110ee4;
    iVar6 = bcmp(config,pcVar21,*(size_t *)((long)fconfig_00 + 8));
    if (iVar6 != 0) goto LAB_00111231;
    config = *(fdb_kvs_config **)((long)fconfig_00 + 0x40);
    pcVar21 = (char *)__s_00->body;
    pfStack_a78 = (fdb_doc *)0x110f03;
    iVar6 = bcmp(config,pcVar21,*(size_t *)((long)fconfig_00 + 0x10));
    if (iVar6 != 0) goto LAB_00111226;
    pfStack_a78 = (fdb_doc *)0x110f13;
    fdb_doc_free(fconfig_00);
    auStack_a48._0_8_ = (fdb_doc *)0x0;
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    pfStack_a78 = (fdb_doc *)0x110f29;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_a60._0_8_);
    pfVar27 = fconfig_00;
  } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
  if ((int)unaff_R13 != 10) goto LAB_0011125f;
  pfStack_a78 = (fdb_doc *)0x110f46;
  fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  pfStack_a78 = (fdb_doc *)0x110f50;
  fdb_kvs_close(pfStack_a68);
  pfStack_a78 = (fdb_doc *)0x110f5a;
  fdb_kvs_close(pfStack_a50);
  pfStack_a78 = (fdb_doc *)0x110f64;
  fdb_close((fdb_file_handle *)auStack_a60._8_8_);
  lVar18 = 0;
  do {
    pfStack_a78 = (fdb_doc *)0x110f73;
    fdb_doc_free(apfStack_9c8[lVar18 + -5]);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x14);
  pfStack_a78 = (fdb_doc *)0x110f95;
  fVar5 = fdb_open((fdb_file_handle **)(auStack_a60 + 8),"./mvcc_test2",
                   (fdb_config *)&fStack_740.config.encryption_key);
  pfVar25 = (fdb_doc *)0x14;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111264;
  in_RCX = auStack_a08;
  pfStack_a78 = (fdb_doc *)0x110fb8;
  fVar5 = fdb_kvs_open((fdb_file_handle *)auStack_a60._8_8_,&pfStack_a68,"kv2",
                       (fdb_kvs_config *)in_RCX);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111269;
  in_RCX = "val-a";
  pfStack_a78 = (fdb_doc *)0x110fe3;
  fVar5 = fdb_set_kv(pfStack_a68,"a",1,"val-a",5);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011126e;
  pfStack_a78 = (fdb_doc *)0x110ff7;
  fVar5 = fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111273;
  in_RCX = "val-b";
  pfStack_a78 = (fdb_doc *)0x111022;
  fVar5 = fdb_set_kv(pfStack_a68,"b",1,"val-b",5);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111278;
  pfStack_a78 = (fdb_doc *)0x111036;
  fVar5 = fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011127d;
  in_RCX = "val-c";
  pfStack_a78 = (fdb_doc *)0x111061;
  fVar5 = fdb_set_kv(pfStack_a68,"c",1,"val-c",5);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111282;
  pfStack_a78 = (fdb_doc *)0x111075;
  fVar5 = fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111287;
  pfStack_a78 = (fdb_doc *)0x11108c;
  fVar5 = fdb_get_kvs_info(pfStack_a68,(fdb_kvs_info *)(auStack_a48 + 0x10));
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011128c;
  in_RCX = (char *)0x1;
  pfStack_a78 = (fdb_doc *)0x1110c8;
  fVar5 = fdb_iterator_init(pfStack_a68,(fdb_iterator **)auStack_a60,"a",1,"c",1,0);
  pfVar25 = pfStack_a30;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111291;
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x1110e8;
  fVar5 = fdb_iterator_seek((fdb_iterator *)auStack_a60._0_8_,"b",1,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111296;
  pfStack_a78 = (fdb_doc *)0x1110fa;
  fVar5 = fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011129b;
  pfStack_a78 = (fdb_doc *)0x111114;
  fVar5 = fdb_snapshot_open(pfStack_a68,&pfStack_a50,(fdb_seqnum_t)pfStack_a30);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001112a0;
  in_RCX = (char *)0x1;
  pfStack_a78 = (fdb_doc *)0x11114b;
  fVar5 = fdb_iterator_init(pfStack_a50,(fdb_iterator **)auStack_a60,"a",1,"c",1,0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001112a5;
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x11116b;
  fVar5 = fdb_iterator_seek((fdb_iterator *)auStack_a60._0_8_,"b",1,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001112aa;
  pfStack_a78 = (fdb_doc *)0x11117d;
  fVar5 = fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_a78 = (fdb_doc *)0x11118f;
    fdb_kvs_close(pfStack_a68);
    pfStack_a78 = (fdb_doc *)0x111199;
    fdb_kvs_close(pfStack_a50);
    pfStack_a78 = (fdb_doc *)0x1111a3;
    fdb_close((fdb_file_handle *)auStack_a60._8_8_);
    pfStack_a78 = (fdb_doc *)0x1111a8;
    fdb_shutdown();
    pfStack_a78 = (fdb_doc *)0x1111ad;
    memleak_end();
    pcVar21 = "%s PASSED\n";
    if (snapshot_test()::__test_pass != '\0') {
      pcVar21 = "%s FAILED\n";
    }
    pfStack_a78 = (fdb_doc *)0x1111de;
    fprintf(_stderr,pcVar21,"snapshot test");
    return;
  }
  goto LAB_001112af;
LAB_00111b40:
  pfStack_1388 = (fdb_kvs_handle *)0x111b45;
  snapshot_with_uncomitted_data_test();
  pfVar17 = (fdb_kvs_handle *)pcVar28;
LAB_00111b45:
  pfStack_1388 = (fdb_kvs_handle *)0x111b4a;
  snapshot_with_uncomitted_data_test();
  goto LAB_00111b4a;
LAB_00113057:
  pfStack_1ed0 = (fdb_kvs_handle *)0x11305c;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfVar12 = (fdb_kvs_handle *)pcVar16;
LAB_0011305c:
  pfStack_1ed0 = (fdb_kvs_handle *)0x113061;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113061:
  pfStack_1ed0 = (fdb_kvs_handle *)0x113071;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113071:
  pfStack_1ed0 = (fdb_kvs_handle *)0x11307c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011307c:
  pfStack_1ed0 = (fdb_kvs_handle *)0x11308c;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011308c:
  pcVar16 = (char *)pfVar12;
  pfStack_1ed0 = (fdb_kvs_handle *)0x113091;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113091:
  pfStack_1ed0 = (fdb_kvs_handle *)0x1130a1;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130a1:
  pfStack_1ed0 = (fdb_kvs_handle *)0x1130ac;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ac:
  pfStack_1ed0 = (fdb_kvs_handle *)0x1130b7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130b7:
  pfStack_1ed0 = (fdb_kvs_handle *)0x1130c7;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130c7:
  pfStack_1ed0 = (fdb_kvs_handle *)0x1130d2;
  in_memory_snapshot_on_dirty_hbtrie_test();
  goto LAB_001130d2;
LAB_00113614:
  pfStack_22e8 = (fdb_kvs_handle *)0x113624;
  in_memory_snapshot_compaction_test();
LAB_00113624:
  pfStack_22e8 = (fdb_kvs_handle *)0x11362f;
  in_memory_snapshot_compaction_test();
LAB_0011362f:
  pfStack_22e8 = (fdb_kvs_handle *)0x11363f;
  in_memory_snapshot_compaction_test();
LAB_0011363f:
  pfStack_22e8 = (fdb_kvs_handle *)0x11364a;
  in_memory_snapshot_compaction_test();
  goto LAB_0011364a;
LAB_00113ba0:
  pcStack_25a0 = (code *)0x113bb0;
  cb_inmem_snap();
LAB_00113bb0:
  pcStack_25a0 = (code *)0x113bc0;
  cb_inmem_snap();
LAB_00113bc0:
  pcStack_25a0 = (code *)0x113bd0;
  cb_inmem_snap();
LAB_00113bd0:
  _Var13._M_i = (__int_type)(auStack_2518 + 0x100);
  pfVar23 = (fdb_kvs_handle *)auStack_2518;
  pcStack_25a0 = (code *)0x113be0;
  cb_inmem_snap();
  goto LAB_00113be0;
LAB_00114672:
  pfStack_2b18 = (fdb_iterator *)0x11467d;
  snapshot_clone_test();
  pfVar15 = pfVar14;
LAB_0011467d:
  pfVar14 = pfVar15;
  pfStack_2b18 = (fdb_iterator *)0x114682;
  snapshot_clone_test();
LAB_00114682:
  pfStack_2b18 = (fdb_iterator *)0x11468d;
  snapshot_clone_test();
LAB_0011468d:
  pfVar12 = (fdb_kvs_handle *)&pfStack_2b00;
  pfStack_2b18 = (fdb_iterator *)0x114698;
  snapshot_clone_test();
  goto LAB_00114698;
LAB_00111216:
  pfStack_a78 = (fdb_doc *)0x111221;
  snapshot_test();
  pfVar27 = fconfig_00;
LAB_00111221:
  fconfig_00 = pfVar27;
  pfStack_a78 = (fdb_doc *)0x111226;
  snapshot_test();
LAB_00111226:
  pfStack_a78 = (fdb_doc *)0x111231;
  snapshot_test();
LAB_00111231:
  pfVar25 = (fdb_doc *)auStack_a48;
  pfStack_a78 = (fdb_doc *)0x11123c;
  snapshot_test();
LAB_0011123c:
  pfStack_a78 = (fdb_doc *)0x111241;
  snapshot_test();
LAB_00111241:
  pfStack_a78 = (fdb_doc *)0x111246;
  snapshot_test();
LAB_00111246:
  pfStack_a78 = (fdb_doc *)0x11124b;
  snapshot_test();
LAB_0011124b:
  pfStack_a78 = (fdb_doc *)0x111250;
  snapshot_test();
LAB_00111250:
  pfStack_a78 = (fdb_doc *)0x111255;
  snapshot_test();
LAB_00111255:
  pfStack_a78 = (fdb_doc *)0x11125a;
  snapshot_test();
LAB_0011125a:
  pfStack_a78 = (fdb_doc *)0x11125f;
  snapshot_test();
LAB_0011125f:
  pfStack_a78 = (fdb_doc *)0x111264;
  snapshot_test();
LAB_00111264:
  pfStack_a78 = (fdb_doc *)0x111269;
  snapshot_test();
LAB_00111269:
  pfStack_a78 = (fdb_doc *)0x11126e;
  snapshot_test();
LAB_0011126e:
  pfStack_a78 = (fdb_doc *)0x111273;
  snapshot_test();
LAB_00111273:
  pfStack_a78 = (fdb_doc *)0x111278;
  snapshot_test();
LAB_00111278:
  pfStack_a78 = (fdb_doc *)0x11127d;
  snapshot_test();
LAB_0011127d:
  pfStack_a78 = (fdb_doc *)0x111282;
  snapshot_test();
LAB_00111282:
  pfStack_a78 = (fdb_doc *)0x111287;
  snapshot_test();
LAB_00111287:
  pfStack_a78 = (fdb_doc *)0x11128c;
  snapshot_test();
LAB_0011128c:
  pfStack_a78 = (fdb_doc *)0x111291;
  snapshot_test();
LAB_00111291:
  pfStack_a78 = (fdb_doc *)0x111296;
  snapshot_test();
LAB_00111296:
  pfStack_a78 = (fdb_doc *)0x11129b;
  snapshot_test();
LAB_0011129b:
  pfStack_a78 = (fdb_doc *)0x1112a0;
  snapshot_test();
LAB_001112a0:
  pfStack_a78 = (fdb_doc *)0x1112a5;
  snapshot_test();
LAB_001112a5:
  pfStack_a78 = (fdb_doc *)0x1112aa;
  snapshot_test();
LAB_001112aa:
  pfStack_a78 = (fdb_doc *)0x1112af;
  snapshot_test();
LAB_001112af:
  pfStack_a78 = (fdb_doc *)snapshot_stats_test;
  snapshot_test();
  pfStack_fc0 = (fdb_kvs_handle *)0x1112d1;
  pfStack_aa0 = pfVar25;
  pfStack_a98 = (fdb_kvs_handle *)pcVar21;
  pfStack_a90 = (fdb_kvs_handle *)unaff_R13;
  pfStack_a88 = fconfig_00;
  pfStack_a80 = config;
  pfStack_a78 = __s_00;
  gettimeofday(&tStack_f60,(__timezone_ptr_t)0x0);
  pfStack_fc0 = (fdb_kvs_handle *)0x1112d6;
  memleak_start();
  pfStack_fc0 = (fdb_kvs_handle *)0x1112e5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = (fdb_config *)(auStack_d98 + 0x200);
  pfStack_fc0 = (fdb_kvs_handle *)0x1112f5;
  fdb_get_default_config();
  pcVar16 = auStack_f50;
  pfStack_fc0 = (fdb_kvs_handle *)0x111302;
  fdb_get_default_kvs_config();
  uStack_b90 = 0;
  uStack_b88 = 0x400;
  uStack_b74 = 1;
  uStack_b69 = 0;
  pfStack_fc0 = (fdb_kvs_handle *)0x111327;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_fc0 = (fdb_kvs_handle *)0x11133e;
  fVar5 = fdb_open((fdb_file_handle **)&phStack_fa0,"./mvcc_test1",pfVar11);
  handle._M_i = (__int_type)(uint)fVar5;
  pfStack_fc0 = (fdb_kvs_handle *)0x111350;
  fdb_kvs_open_default((fdb_file_handle *)phStack_fa0,&pfStack_fa8,(fdb_kvs_config *)pcVar16);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar21 = (char *)0x0;
    uVar24 = 0;
    do {
      pfStack_fc0 = (fdb_kvs_handle *)0x111378;
      sprintf(auStack_d98 + 0x100,"key%d",uVar24 & 0xffffffff);
      pfStack_fc0 = (fdb_kvs_handle *)0x111390;
      sprintf(auStack_d98,"meta%d",uVar24 & 0xffffffff);
      pfStack_fc0 = (fdb_kvs_handle *)0x1113a8;
      sprintf(acStack_e98,"body%d",uVar24 & 0xffffffff);
      pcVar16 = auStack_f50 + (long)pcVar21 + 0x18;
      pfStack_fc0 = (fdb_kvs_handle *)0x1113bb;
      unaff_R13 = (char *)strlen(auStack_d98 + 0x100);
      handle._M_i = (__int_type)auStack_d98;
      pfStack_fc0 = (fdb_kvs_handle *)0x1113ce;
      pfVar11 = (fdb_config *)strlen((char *)handle._M_i);
      pfStack_fc0 = (fdb_kvs_handle *)0x1113de;
      sVar8 = strlen(acStack_e98);
      pfStack_fc0 = (fdb_kvs_handle *)0x111403;
      in_RCX = (char *)handle._M_i;
      fdb_doc_create((fdb_doc **)pcVar16,auStack_d98 + 0x100,(size_t)unaff_R13,(void *)handle._M_i,
                     (size_t)pfVar11,acStack_e98,sVar8);
      pfStack_fc0 = (fdb_kvs_handle *)0x111415;
      fdb_set(pfStack_fa8,*(fdb_doc **)(auStack_f50 + uVar24 * 8 + 0x18));
      pfStack_fc0 = (fdb_kvs_handle *)0x111422;
      fdb_doc_free(*(fdb_doc **)(auStack_f50 + uVar24 * 8 + 0x18));
      uVar24 = uVar24 + 1;
      pcVar21 = (char *)((long)pcVar21 + 8);
    } while (uVar24 != 0x14);
    pfStack_fc0 = (fdb_kvs_handle *)0x111442;
    fdb_commit((fdb_file_handle *)phStack_fa0,'\x01');
    pfStack_fc0 = (fdb_kvs_handle *)0x111451;
    fVar5 = fdb_get_kvs_info(pfStack_fa8,(fdb_kvs_info *)(auStack_f98 + 8));
    seqnum = pphStack_f88;
    pphVar4 = (hbtrie **)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115d6;
    pfStack_fc0 = (fdb_kvs_handle *)0x111476;
    fVar5 = fdb_set_log_callback(pfStack_fa8,logCallbackFunc,"snapshot_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115db;
    pfStack_fc0 = (fdb_kvs_handle *)0x111490;
    fVar5 = fdb_snapshot_open(pfStack_fa8,(fdb_kvs_handle **)auStack_f98,(fdb_seqnum_t)seqnum);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001115e0;
    pfVar11 = (fdb_config *)&pphStack_f88;
    pfStack_fc0 = (fdb_kvs_handle *)0x1114af;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_f98._0_8_,(fdb_kvs_info *)(auStack_f98 + 8));
    if (pphStack_f88 != seqnum) {
      pfStack_fc0 = (fdb_kvs_handle *)0x1114c0;
      snapshot_stats_test();
    }
    pcVar21 = (char *)apkStack_f80;
    if (apkStack_f80[0] != (kvs_info *)0x14) {
      pfStack_fc0 = (fdb_kvs_handle *)0x1114d4;
      snapshot_stats_test();
    }
    pcVar16 = (char *)&phStack_f68;
    if (phStack_f68 != phStack_fa0) {
      pfStack_fc0 = (fdb_kvs_handle *)0x1114f0;
      snapshot_stats_test();
    }
    unaff_R13 = auStack_f98;
    pfStack_fc0 = (fdb_kvs_handle *)0x1114fe;
    fdb_kvs_close((fdb_kvs_handle *)auStack_f98._0_8_);
    pfStack_fc0 = (fdb_kvs_handle *)0x111512;
    fVar5 = fdb_snapshot_open(pfStack_fa8,(fdb_kvs_handle **)unaff_R13,0xffffffffffffffff);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_fc0 = (fdb_kvs_handle *)0x11152c;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_f98._0_8_,(fdb_kvs_info *)(auStack_f98 + 8));
      if (pphStack_f88 != seqnum) {
        pfStack_fc0 = (fdb_kvs_handle *)0x11153d;
        snapshot_stats_test();
      }
      if (apkStack_f80[0] != (kvs_info *)0x14) {
        pfStack_fc0 = (fdb_kvs_handle *)0x11154d;
        snapshot_stats_test();
      }
      if (phStack_f68 != phStack_fa0) {
        pfStack_fc0 = (fdb_kvs_handle *)0x111566;
        snapshot_stats_test();
      }
      pfStack_fc0 = (fdb_kvs_handle *)0x111570;
      fdb_kvs_close((fdb_kvs_handle *)auStack_f98._0_8_);
      pfStack_fc0 = (fdb_kvs_handle *)0x11157a;
      fdb_kvs_close(pfStack_fa8);
      pfStack_fc0 = (fdb_kvs_handle *)0x111584;
      fdb_close((fdb_file_handle *)phStack_fa0);
      pfStack_fc0 = (fdb_kvs_handle *)0x111589;
      fdb_shutdown();
      pfStack_fc0 = (fdb_kvs_handle *)0x11158e;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (snapshot_stats_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_fc0 = (fdb_kvs_handle *)0x1115bf;
      fprintf(_stderr,pcVar21,"snapshot stats test");
      return;
    }
  }
  else {
    pfStack_fc0 = (fdb_kvs_handle *)0x1115d6;
    snapshot_stats_test();
    pphVar4 = &phStack_fa0;
LAB_001115d6:
    seqnum = pphVar4;
    pfStack_fc0 = (fdb_kvs_handle *)0x1115db;
    snapshot_stats_test();
LAB_001115db:
    pfStack_fc0 = (fdb_kvs_handle *)0x1115e0;
    snapshot_stats_test();
LAB_001115e0:
    pfStack_fc0 = (fdb_kvs_handle *)0x1115e5;
    snapshot_stats_test();
  }
  pfStack_fc0 = (fdb_kvs_handle *)snapshot_with_uncomitted_data_test;
  snapshot_stats_test();
  pfStack_1388 = (fdb_kvs_handle *)0x11160a;
  pphStack_fe8 = seqnum;
  pfStack_fe0 = (fdb_kvs_handle *)pcVar21;
  pfStack_fd8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_fd0 = pfVar11;
  pfStack_fc8 = (fdb_kvs_handle *)pcVar16;
  pfStack_fc0 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_1318 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_10f0 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_10e8,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1388 = (fdb_kvs_handle *)0x111632;
  system((char *)&pfStack_10f0);
  pfStack_1388 = (fdb_kvs_handle *)0x111637;
  memleak_start();
  pfStack_1388 = (fdb_kvs_handle *)0x111641;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pfStack_1388 = (fdb_kvs_handle *)0x11164e;
  srand(0x4d2);
  pfVar17 = (fdb_kvs_handle *)(auStack_12f0 + 0x108);
  pfStack_1388 = (fdb_kvs_handle *)0x11165e;
  fdb_get_default_config();
  uStack_11c8 = 1;
  uStack_11d0 = '\x01';
  uStack_11a8 = 1;
  sStack_11e0 = 0;
  pfStack_1388 = (fdb_kvs_handle *)0x11167e;
  fdb_get_default_kvs_config();
  pfStack_1388 = (fdb_kvs_handle *)0x111692;
  fVar5 = fdb_open(&pfStack_1360,"./mvcc_test9",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = auStack_1318;
    pfStack_1388 = (fdb_kvs_handle *)0x1116b0;
    fVar5 = fdb_kvs_open(pfStack_1360,&pfStack_1370,(char *)0x0,(fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b4f;
    in_RCX = auStack_1318;
    pfStack_1388 = (fdb_kvs_handle *)0x1116d3;
    fVar5 = fdb_kvs_open(pfStack_1360,&pfStack_1368,"db1",(fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b54;
    in_RCX = auStack_1318;
    pfStack_1388 = (fdb_kvs_handle *)0x1116f6;
    fVar5 = fdb_kvs_open(pfStack_1360,&pfStack_1378,"db2",(fdb_kvs_config *)in_RCX);
    pcVar28 = (char *)pfVar17;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b59;
    puStack_1358 = (undefined4 *)((long)&pfVar12->kvs + 2);
    pcVar28 = "key%06d";
    pcVar16 = auStack_12f0;
    pcVar21 = "value%d";
    handle._M_i = 0;
    do {
      pfStack_1388 = (fdb_kvs_handle *)0x111731;
      sprintf(pcVar16,"key%06d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1358 + 1) = 0x3e;
      *puStack_1358 = 0x646e653c;
      pfStack_1388 = (fdb_kvs_handle *)0x11175f;
      sprintf((char *)pfVar12,"value%d",handle._M_i);
      pfVar17 = pfStack_1370;
      pfStack_1388 = (fdb_kvs_handle *)0x11176c;
      sVar8 = strlen(pcVar16);
      pfStack_1388 = (fdb_kvs_handle *)0x111784;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar17,pcVar16,sVar8 + 1,pfVar12,0x20);
      pfVar23 = pfStack_1368;
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1388 = (fdb_kvs_handle *)0x111b36;
        snapshot_with_uncomitted_data_test();
LAB_00111b36:
        unaff_R13 = (char *)pfVar17;
        pfStack_1388 = (fdb_kvs_handle *)0x111b3b;
        snapshot_with_uncomitted_data_test();
LAB_00111b3b:
        pfStack_1388 = (fdb_kvs_handle *)0x111b40;
        snapshot_with_uncomitted_data_test();
        goto LAB_00111b40;
      }
      pfStack_1388 = (fdb_kvs_handle *)0x111799;
      sVar8 = strlen(pcVar16);
      pfStack_1388 = (fdb_kvs_handle *)0x1117b1;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar23,pcVar16,sVar8 + 1,pfVar12,0x20);
      unaff_R13 = (char *)pfStack_1378;
      pfVar17 = pfVar23;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b36;
      pfStack_1388 = (fdb_kvs_handle *)0x1117c6;
      sVar8 = strlen(pcVar16);
      pfStack_1388 = (fdb_kvs_handle *)0x1117de;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar16,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b3b;
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 10);
    pfStack_1388 = (fdb_kvs_handle *)0x111800;
    fVar5 = fdb_get_kvs_info(pfStack_1370,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b5e;
    pfStack_1388 = (fdb_kvs_handle *)0x11181a;
    fVar5 = fdb_snapshot_open(pfStack_1370,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b63;
    pfStack_1388 = (fdb_kvs_handle *)0x111831;
    fVar5 = fdb_get_kvs_info(pfStack_1368,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b68;
    pfStack_1388 = (fdb_kvs_handle *)0x11184b;
    fVar5 = fdb_snapshot_open(pfStack_1368,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b6d;
    pfStack_1388 = (fdb_kvs_handle *)0x111862;
    fVar5 = fdb_get_kvs_info(pfStack_1378,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b72;
    pfStack_1388 = (fdb_kvs_handle *)0x11187c;
    fVar5 = fdb_snapshot_open(pfStack_1378,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111b77;
    pfStack_1388 = (fdb_kvs_handle *)0x111890;
    fVar5 = fdb_commit(pfStack_1360,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b7c;
    pfStack_1388 = (fdb_kvs_handle *)0x1118a7;
    fVar5 = fdb_get_kvs_info(pfStack_1368,(fdb_kvs_info *)auStack_1350);
    pfVar17 = (fdb_kvs_handle *)auStack_1350._8_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b81;
    pfStack_1388 = (fdb_kvs_handle *)0x1118c2;
    fVar5 = fdb_get_kvs_info(pfStack_1378,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b86;
    pcVar16 = auStack_1350 + 8;
    if (pfVar17 != (fdb_kvs_handle *)auStack_1350._8_8_) {
      pfStack_1388 = (fdb_kvs_handle *)0x1118df;
      snapshot_with_uncomitted_data_test();
    }
    pfStack_1388 = (fdb_kvs_handle *)0x1118ee;
    fVar5 = fdb_get_kvs_info(pfStack_1370,(fdb_kvs_info *)auStack_1350);
    pcVar28 = (char *)pfVar17;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b8b;
    if (pfVar17 != (fdb_kvs_handle *)auStack_1350._8_8_) {
      pfStack_1388 = (fdb_kvs_handle *)0x111908;
      snapshot_with_uncomitted_data_test();
    }
    pfStack_1320 = pfVar17;
    pcVar16 = "key%06d";
    pcVar21 = auStack_12f0;
    unaff_R13 = "value%d";
    handle._M_i = 0;
    do {
      pfStack_1388 = (fdb_kvs_handle *)0x111934;
      sprintf(pcVar21,"key%06d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1358 + 1) = 0x3e;
      *puStack_1358 = 0x646e653c;
      pfStack_1388 = (fdb_kvs_handle *)0x111962;
      sprintf((char *)pfVar12,"value%d",handle._M_i);
      pfVar17 = pfStack_1370;
      pfStack_1388 = (fdb_kvs_handle *)0x11196f;
      sVar8 = strlen(pcVar21);
      pfStack_1388 = (fdb_kvs_handle *)0x111987;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar17,pcVar21,sVar8 + 1,pfVar12,0x20);
      pcVar28 = (char *)pfStack_1378;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b45;
      pfStack_1388 = (fdb_kvs_handle *)0x11199c;
      sVar8 = strlen(pcVar21);
      pfStack_1388 = (fdb_kvs_handle *)0x1119b4;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)pcVar28,pcVar21,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b40;
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 10);
    pfStack_1388 = (fdb_kvs_handle *)0x1119d6;
    fVar5 = fdb_get_kvs_info(pfStack_1368,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b90;
    pfStack_1388 = (fdb_kvs_handle *)0x1119f0;
    fVar5 = fdb_snapshot_open(pfStack_1368,&pfStack_1380,auStack_1350._8_8_);
    pcVar28 = (char *)pfStack_1320;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b95;
    pfStack_1388 = (fdb_kvs_handle *)0x111a06;
    fVar5 = fdb_kvs_close(pfStack_1380);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b9a;
    pfStack_1388 = (fdb_kvs_handle *)0x111a1d;
    fVar5 = fdb_get_kvs_info(pfStack_1378,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111b9f;
    pfStack_1388 = (fdb_kvs_handle *)0x111a37;
    fVar5 = fdb_snapshot_open(pfStack_1378,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111ba4;
    pfStack_1388 = (fdb_kvs_handle *)0x111a4f;
    fVar5 = fdb_snapshot_open(pfStack_1378,&pfStack_1380,(fdb_seqnum_t)pcVar28);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111ba9;
    pfStack_1388 = (fdb_kvs_handle *)0x111a60;
    fVar5 = fdb_kvs_close(pfStack_1380);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bae;
    pfStack_1388 = (fdb_kvs_handle *)0x111a77;
    fVar5 = fdb_get_kvs_info(pfStack_1370,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bb3;
    pfStack_1388 = (fdb_kvs_handle *)0x111a91;
    fVar5 = fdb_snapshot_open(pfStack_1370,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111bb8;
    pfStack_1388 = (fdb_kvs_handle *)0x111aa9;
    fVar5 = fdb_snapshot_open(pfStack_1370,&pfStack_1380,(fdb_seqnum_t)pcVar28);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bbd;
    pfStack_1388 = (fdb_kvs_handle *)0x111aba;
    fVar5 = fdb_kvs_close(pfStack_1380);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bc2;
    pfStack_1388 = (fdb_kvs_handle *)0x111acc;
    fVar5 = fdb_close(pfStack_1360);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111bc7;
    pfStack_1388 = (fdb_kvs_handle *)0x111ad9;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1388 = (fdb_kvs_handle *)0x111ae9;
      free(pfVar12);
      pfStack_1388 = (fdb_kvs_handle *)0x111aee;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_1388 = (fdb_kvs_handle *)0x111b1f;
      fprintf(_stderr,pcVar21,"snapshot with uncomitted data in other KVS test");
      return;
    }
  }
  else {
LAB_00111b4a:
    pfStack_1388 = (fdb_kvs_handle *)0x111b4f;
    snapshot_with_uncomitted_data_test();
LAB_00111b4f:
    pfStack_1388 = (fdb_kvs_handle *)0x111b54;
    snapshot_with_uncomitted_data_test();
LAB_00111b54:
    pfStack_1388 = (fdb_kvs_handle *)0x111b59;
    snapshot_with_uncomitted_data_test();
    pcVar28 = (char *)pfVar17;
LAB_00111b59:
    pfStack_1388 = (fdb_kvs_handle *)0x111b5e;
    snapshot_with_uncomitted_data_test();
LAB_00111b5e:
    pfStack_1388 = (fdb_kvs_handle *)0x111b63;
    snapshot_with_uncomitted_data_test();
LAB_00111b63:
    pfStack_1388 = (fdb_kvs_handle *)0x111b68;
    snapshot_with_uncomitted_data_test();
LAB_00111b68:
    pfStack_1388 = (fdb_kvs_handle *)0x111b6d;
    snapshot_with_uncomitted_data_test();
LAB_00111b6d:
    pfStack_1388 = (fdb_kvs_handle *)0x111b72;
    snapshot_with_uncomitted_data_test();
LAB_00111b72:
    pfStack_1388 = (fdb_kvs_handle *)0x111b77;
    snapshot_with_uncomitted_data_test();
LAB_00111b77:
    pfStack_1388 = (fdb_kvs_handle *)0x111b7c;
    snapshot_with_uncomitted_data_test();
LAB_00111b7c:
    pfStack_1388 = (fdb_kvs_handle *)0x111b81;
    snapshot_with_uncomitted_data_test();
LAB_00111b81:
    pfVar17 = (fdb_kvs_handle *)pcVar28;
    pfStack_1388 = (fdb_kvs_handle *)0x111b86;
    snapshot_with_uncomitted_data_test();
LAB_00111b86:
    pfStack_1388 = (fdb_kvs_handle *)0x111b8b;
    snapshot_with_uncomitted_data_test();
    pcVar28 = (char *)pfVar17;
LAB_00111b8b:
    pfStack_1388 = (fdb_kvs_handle *)0x111b90;
    snapshot_with_uncomitted_data_test();
LAB_00111b90:
    pfStack_1388 = (fdb_kvs_handle *)0x111b95;
    snapshot_with_uncomitted_data_test();
LAB_00111b95:
    pfStack_1388 = (fdb_kvs_handle *)0x111b9a;
    snapshot_with_uncomitted_data_test();
LAB_00111b9a:
    pfStack_1388 = (fdb_kvs_handle *)0x111b9f;
    snapshot_with_uncomitted_data_test();
LAB_00111b9f:
    pfStack_1388 = (fdb_kvs_handle *)0x111ba4;
    snapshot_with_uncomitted_data_test();
LAB_00111ba4:
    pfStack_1388 = (fdb_kvs_handle *)0x111ba9;
    snapshot_with_uncomitted_data_test();
LAB_00111ba9:
    pfStack_1388 = (fdb_kvs_handle *)0x111bae;
    snapshot_with_uncomitted_data_test();
LAB_00111bae:
    pfStack_1388 = (fdb_kvs_handle *)0x111bb3;
    snapshot_with_uncomitted_data_test();
LAB_00111bb3:
    pfStack_1388 = (fdb_kvs_handle *)0x111bb8;
    snapshot_with_uncomitted_data_test();
LAB_00111bb8:
    pfStack_1388 = (fdb_kvs_handle *)0x111bbd;
    snapshot_with_uncomitted_data_test();
LAB_00111bbd:
    pfStack_1388 = (fdb_kvs_handle *)0x111bc2;
    snapshot_with_uncomitted_data_test();
LAB_00111bc2:
    pfStack_1388 = (fdb_kvs_handle *)0x111bc7;
    snapshot_with_uncomitted_data_test();
LAB_00111bc7:
    pfStack_1388 = (fdb_kvs_handle *)0x111bcc;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_1388 = (fdb_kvs_handle *)in_memory_snapshot_test;
  snapshot_with_uncomitted_data_test();
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf1;
  pfStack_13b0 = pfVar12;
  pfStack_13a8 = (fdb_kvs_handle *)pcVar21;
  pfStack_13a0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1398 = (fdb_kvs_handle *)pcVar28;
  pfStack_1390 = (fdb_kvs_handle *)pcVar16;
  pfStack_1388 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_1858 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf6;
  memleak_start();
  pcVar28 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c05;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = &fStack_14a8;
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
  fdb_get_default_config();
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c1f;
  fdb_get_default_kvs_config();
  fStack_14a8.buffercache_size = 0;
  fStack_14a8.wal_threshold = 0x400;
  fStack_14a8.flags = 1;
  fStack_14a8.compaction_threshold = '\0';
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c44;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c58;
  fVar5 = fdb_open(&pfStack_18c0,"./mvcc_test1",pfVar11);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c74;
    fVar5 = fdb_kvs_open_default(pfStack_18c0,&pfStack_18d0,&fStack_1870);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112359;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c8d;
    fVar5 = fdb_snapshot_open(pfStack_18d0,&pfStack_18c8,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011235e;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ca4;
    fdb_get_kvs_info(pfStack_18c8,&fStack_18a0);
    if ((fdb_config *)fStack_18a0.last_seqnum != (fdb_config *)0x0) {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cb4;
      in_memory_snapshot_test();
    }
    pcVar28 = auStack_18b8;
    in_RCX = (char *)0x0;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cd7;
    fdb_iterator_init(pfStack_18c8,(fdb_iterator **)pcVar28,(void *)0x0,0,(void *)0x0,0,0);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ce4;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_18b8._0_8_,(fdb_doc **)(auStack_18b8 + 8));
    _Var13._M_i = (__int_type)pfVar11;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112363;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
    fdb_iterator_close((fdb_iterator *)auStack_18b8._0_8_);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d01;
    fdb_kvs_close(pfStack_18c8);
    lVar18 = 0;
    uVar24 = 0;
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d23;
      sprintf(acStack_17a8,"key%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d3f;
      sprintf(auStack_16a8,"meta%d",uVar24 & 0xffffffff);
      pcVar21 = auStack_16a8 + 0x100;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d5b;
      sprintf(pcVar21,"body%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6e;
      sVar8 = strlen(acStack_17a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d79;
      sVar9 = strlen(auStack_16a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d84;
      sVar10 = strlen(pcVar21);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
      fdb_doc_create((fdb_doc **)(auStack_1858 + lVar18),acStack_17a8,sVar8,auStack_16a8,sVar9,
                     pcVar21,sVar10);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dbb;
      fdb_set(pfStack_18d0,*(fdb_doc **)(auStack_1858 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar24 != 5);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ddb;
    fdb_commit(pfStack_18c0,'\x01');
    uVar24 = 5;
    ppfVar26 = (fdb_doc **)(auStack_1858 + 0x28);
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e05;
      sprintf(acStack_17a8,"key%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e21;
      sprintf(auStack_16a8,"meta%d",uVar24 & 0xffffffff);
      pcVar21 = auStack_16a8 + 0x100;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3d;
      sprintf(pcVar21,"body%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e45;
      sVar8 = strlen(acStack_17a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e50;
      sVar9 = strlen(auStack_16a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e5b;
      sVar10 = strlen(pcVar21);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e7b;
      fdb_doc_create(ppfVar26,acStack_17a8,sVar8,auStack_16a8,sVar9,pcVar21,sVar10);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e88;
      fdb_set(pfStack_18d0,*ppfVar26);
      uVar24 = uVar24 + 1;
      ppfVar26 = ppfVar26 + 1;
    } while (uVar24 != 9);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eb7;
    sprintf(acStack_17a8,"key%d",9);
    pcVar16 = auStack_16a8;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed5;
    sprintf(pcVar16,"meta%d",9);
    pcVar21 = auStack_16a8 + 0x100;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ef3;
    sprintf(pcVar21,"Body%d",9);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f03;
    unaff_R13 = (char *)strlen(acStack_17a8);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f0e;
    handle._M_i = strlen(pcVar16);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f19;
    sVar8 = strlen(pcVar21);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f34;
    in_RCX = pcVar16;
    fdb_doc_create((fdb_doc **)(auStack_1858 + 0x48),acStack_17a8,(size_t)unaff_R13,pcVar16,
                   handle._M_i,pcVar21,sVar8);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f41;
    fdb_set(pfStack_18d0,(fdb_doc *)auStack_1858._72_8_);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4d;
    fdb_commit(pfStack_18c0,'\0');
    **(undefined1 **)(auStack_1858._72_8_ + 0x40) = 0x62;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f64;
    fdb_set(pfStack_18d0,(fdb_doc *)auStack_1858._72_8_);
    _Var13._M_i = *(fdb_seqnum_t *)(auStack_1858._72_8_ + 0x28);
    pcVar28 = (char *)&fStack_18a0;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f7d;
    fdb_get_kvs_info(pfStack_18d0,(fdb_kvs_info *)pcVar28);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f90;
    fVar5 = fdb_snapshot_open(pfStack_18d0,&pfStack_18c8,fStack_18a0.last_seqnum);
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00112368;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fb4;
    pfStack_18a8 = (fdb_config *)_Var13._M_i;
    fVar5 = fdb_snapshot_open(pfStack_18d0,&pfStack_18c8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011236d;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc8;
    fdb_commit(pfStack_18c0,'\0');
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_set(pfStack_18d0,(fdb_doc *)auStack_1858._72_8_);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fe6;
    fdb_commit(pfStack_18c0,'\0');
    uVar24 = 10;
    pcVar28 = (char *)0x50;
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11200d;
      sprintf(acStack_17a8,"key%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112029;
      sprintf(auStack_16a8,"meta%d",uVar24 & 0xffffffff);
      pcVar21 = auStack_16a8 + 0x100;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112045;
      sprintf(pcVar21,"body%d",uVar24 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_1858 + (long)pcVar28);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112058;
      _Var13._M_i = strlen(acStack_17a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112063;
      unaff_R13 = (char *)strlen(auStack_16a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206e;
      sVar8 = strlen(pcVar21);
      in_RCX = auStack_16a8;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112093;
      fdb_doc_create((fdb_doc **)handle._M_i,acStack_17a8,_Var13._M_i,in_RCX,(size_t)unaff_R13,
                     pcVar21,sVar8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120a5;
      fdb_set(pfStack_18d0,*(fdb_doc **)(auStack_1858 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      pcVar28 = (char *)((long)pcVar28 + 8);
    } while (uVar24 != 0xf);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120ce;
    fVar5 = fdb_set_log_callback(pfStack_18d0,logCallbackFunc,"in_memory_snapshot_test");
    pcVar16 = (char *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112372;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120e8;
    fdb_get_kvs_info(pfStack_18c8,&fStack_18a0);
    if ((fdb_config *)fStack_18a0.last_seqnum != pfStack_18a8) {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120fd;
      in_memory_snapshot_test();
    }
    uVar24 = 0xf;
    pfVar11 = (fdb_config *)(auStack_1858 + 0x78);
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112125;
      sprintf(acStack_17a8,"key%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112140;
      sprintf(auStack_16a8,"meta%d",uVar24 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_16a8 + 0x100);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215b;
      sprintf((char *)handle._M_i,"body%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112163;
      pcVar16 = (char *)strlen(acStack_17a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216e;
      pcVar21 = (char *)strlen(auStack_16a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112179;
      sVar8 = strlen((char *)handle._M_i);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112199;
      fdb_doc_create((fdb_doc **)pfVar11,acStack_17a8,(size_t)pcVar16,auStack_16a8,(size_t)pcVar21,
                     (void *)handle._M_i,sVar8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a6;
      fdb_set(pfStack_18d0,*(fdb_doc **)pfVar11);
      uVar24 = uVar24 + 1;
      pfVar11 = (fdb_config *)((long)pfVar11 + 8);
    } while (uVar24 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121c6;
    fdb_commit(pfStack_18c0,'\0');
    in_RCX = (char *)0x0;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121e6;
    fdb_iterator_init(pfStack_18c8,(fdb_iterator **)auStack_18b8,(void *)0x0,0,(void *)0x0,0,0);
    pcVar28 = auStack_18b8 + 8;
    auStack_18b8._8_8_ = (fdb_config *)0x0;
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ff;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_18b8._0_8_,(fdb_doc **)pcVar28);
      _Var13._M_i = auStack_18b8._8_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00112339:
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11233e
        ;
        in_memory_snapshot_test();
LAB_0011233e:
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112349
        ;
        in_memory_snapshot_test();
LAB_00112349:
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112354
        ;
        in_memory_snapshot_test();
        goto LAB_00112354;
      }
      pcVar16 = *(char **)(auStack_18b8._8_8_ + 0x20);
      handle._M_i = *(__int_type *)(auStack_1858 + (long)unaff_R13 * 8);
      pcVar21 = (char *)((fdb_kvs_handle *)handle._M_i)->op_stats;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222a;
      iVar6 = bcmp(pcVar16,pcVar21,*(size_t *)auStack_18b8._8_8_);
      pfVar11 = (fdb_config *)_Var13._M_i;
      if (iVar6 != 0) {
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112339
        ;
        in_memory_snapshot_test();
        goto LAB_00112339;
      }
      pcVar16 = *(char **)(_Var13._M_i + 0x38);
      pcVar21 = (char *)((fdb_kvs_handle *)handle._M_i)->staletree;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112249;
      iVar6 = bcmp(pcVar16,pcVar21,*(uint64_t *)(_Var13._M_i + 8));
      if (iVar6 != 0) goto LAB_00112349;
      pcVar16 = *(char **)(_Var13._M_i + 0x40);
      pcVar21 = (char *)(((fdb_kvs_handle *)handle._M_i)->field_6).seqtree;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112268;
      iVar6 = bcmp(pcVar16,pcVar21,*(uint64_t *)(_Var13._M_i + 0x10));
      if (iVar6 != 0) goto LAB_0011233e;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112278;
      fdb_doc_free((fdb_doc *)_Var13._M_i);
      auStack_18b8._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11228e;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_18b8._0_8_);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122ab;
      fdb_iterator_close((fdb_iterator *)auStack_18b8._0_8_);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122b5;
      fdb_kvs_close(pfStack_18d0);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122bf;
      fdb_kvs_close(pfStack_18c8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122c9;
      fdb_close(pfStack_18c0);
      lVar18 = 0;
      do {
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122d8
        ;
        fdb_doc_free(*(fdb_doc **)(auStack_1858 + lVar18 * 8));
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x14);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122e6;
      fdb_shutdown();
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1122eb;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11231c;
      fprintf(_stderr,pcVar21,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112354:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112359;
    in_memory_snapshot_test();
LAB_00112359:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11235e;
    in_memory_snapshot_test();
LAB_0011235e:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112363;
    in_memory_snapshot_test();
    _Var13._M_i = (__int_type)pfVar11;
LAB_00112363:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112368;
    in_memory_snapshot_test();
LAB_00112368:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11236d;
    in_memory_snapshot_test();
LAB_0011236d:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112372;
    in_memory_snapshot_test();
LAB_00112372:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112377;
    in_memory_snapshot_test();
  }
  aStack_18e0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle_00 = (char *)0x0;
  pfStack_1b08 = (fdb_kvs_handle *)0x11239f;
  pfStack_1908 = (fdb_kvs_info *)pcVar28;
  aStack_1900.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)pcVar21;
  pfStack_18f8 = (fdb_kvs_handle *)unaff_R13;
  aStack_18f0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
  pfStack_18e8 = (fdb_kvs_handle *)pcVar16;
  aStack_18e0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)handle._M_i;
  gettimeofday(&tStack_1a30,(__timezone_ptr_t)0x0);
  pfStack_1b08 = (fdb_kvs_handle *)0x1123a4;
  memleak_start();
  aStack_1ae8.seqtree = (btree *)0x0;
  pcVar16 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_1b08 = (fdb_kvs_handle *)0x1123b8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar17 = (fdb_kvs_handle *)&fStack_1a20.seqtree_opt;
  pfStack_1b08 = (fdb_kvs_handle *)0x1123c8;
  fdb_get_default_config();
  pfStack_1b08 = (fdb_kvs_handle *)0x1123d2;
  fdb_get_default_kvs_config();
  fStack_1a20.compaction_minimum_filesize = 0x400;
  fStack_1a20._68_4_ = 1;
  fStack_1a20.prefetch_duration._7_1_ = '\0';
  fStack_1a20.breakpad_minidump_dir = (char *)0x0;
  pfStack_1b08 = (fdb_kvs_handle *)0x1123f6;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1b08 = (fdb_kvs_handle *)0x11240a;
  fVar5 = fdb_open(&pfStack_1af0,"./mvcc_test1",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_1b08 = (fdb_kvs_handle *)0x112426;
    fVar5 = fdb_kvs_open_default(pfStack_1af0,&pfStack_1af8,&fStack_1aa8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ba;
    pfStack_1b08 = (fdb_kvs_handle *)0x112446;
    fVar5 = fdb_set_log_callback(pfStack_1af8,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127bf;
    pcVar16 = (char *)aaStack_1a50;
    aaStack_1a50[0]._0_4_ = 0x79656b;
    pfVar17 = (fdb_kvs_handle *)&fStack_1a70;
    fStack_1a70._4_1_ = 0;
    fStack_1a70.create_if_missing = true;
    fStack_1a70._1_3_ = 0x617465;
    handle_00 = &fStack_1a90.create_if_missing;
    fStack_1a90._4_1_ = 0;
    fStack_1a90.create_if_missing = true;
    fStack_1a90._1_3_ = 0x79646f;
    pfStack_1b08 = (fdb_kvs_handle *)0x112489;
    pcVar21 = (char *)strlen(pcVar16);
    pfStack_1b08 = (fdb_kvs_handle *)0x112494;
    unaff_R13 = (char *)strlen((char *)pfVar17);
    pfStack_1b08 = (fdb_kvs_handle *)0x11249f;
    sVar8 = strlen(handle_00);
    handle._M_i = (__int_type)&aStack_1ae8;
    pfStack_1b08 = (fdb_kvs_handle *)0x1124bf;
    in_RCX = (char *)pfVar17;
    fdb_doc_create((fdb_doc **)handle._M_i,pcVar16,(size_t)pcVar21,pfVar17,(size_t)unaff_R13,
                   handle_00,sVar8);
    pfStack_1b08 = (fdb_kvs_handle *)0x1124cd;
    fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    pfStack_1b08 = (fdb_kvs_handle *)0x1124d9;
    fdb_commit(pfStack_1af0,'\0');
    pfStack_1b08 = (fdb_kvs_handle *)0x1124ef;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ac8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127c4;
    pfStack_1b08 = (fdb_kvs_handle *)0x112506;
    fVar5 = fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127c9;
    pfStack_1b08 = (fdb_kvs_handle *)0x11251a;
    fVar5 = fdb_commit(pfStack_1af0,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ce;
    pfStack_1b08 = (fdb_kvs_handle *)0x112538;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ad0,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127d3;
    pfStack_1b08 = (fdb_kvs_handle *)0x11254f;
    fVar5 = fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127d8;
    pfStack_1b08 = (fdb_kvs_handle *)0x112563;
    fVar5 = fdb_commit(pfStack_1af0,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127dd;
    pfStack_1b08 = (fdb_kvs_handle *)0x11257a;
    fVar5 = fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127e2;
    pfStack_1b08 = (fdb_kvs_handle *)0x11258e;
    fVar5 = fdb_commit(pfStack_1af0,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127e7;
    pcVar16 = (char *)&aStack_1ae8;
    pfStack_1b08 = (fdb_kvs_handle *)0x1125a3;
    fdb_doc_free((fdb_doc *)aStack_1ae8.seqtree);
    pfVar17 = (fdb_kvs_handle *)&fStack_1a20;
    fStack_1a20.chunksize = 0x654b;
    fStack_1a20._2_2_ = 0x79;
    pfStack_1b08 = (fdb_kvs_handle *)0x1125ba;
    handle_00 = (char *)strlen((char *)pfVar17);
    pcVar21 = &fStack_1a70.create_if_missing;
    pfStack_1b08 = (fdb_kvs_handle *)0x1125cd;
    unaff_R13 = (char *)strlen(pcVar21);
    handle._M_i = (__int_type)&fStack_1a90;
    pfStack_1b08 = (fdb_kvs_handle *)0x1125dd;
    sVar8 = strlen((char *)handle._M_i);
    pfStack_1b08 = (fdb_kvs_handle *)0x1125f8;
    in_RCX = pcVar21;
    fdb_doc_create((fdb_doc **)pcVar16,pfVar17,(size_t)handle_00,pcVar21,(size_t)unaff_R13,
                   (void *)handle._M_i,sVar8);
    pfStack_1b08 = (fdb_kvs_handle *)0x112605;
    fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    pfStack_1b08 = (fdb_kvs_handle *)0x11261b;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ad8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127ec;
    pcVar16 = (char *)aaStack_1a50;
    pfStack_1b08 = (fdb_kvs_handle *)0x112633;
    sVar8 = strlen(pcVar16);
    pfVar17 = (fdb_kvs_handle *)&pfStack_1ae0;
    in_RCX = (char *)0x0;
    pfStack_1b08 = (fdb_kvs_handle *)0x112656;
    fdb_doc_create((fdb_doc **)pfVar17,pcVar16,sVar8,(void *)0x0,0,(void *)0x0,0);
    pfStack_1b08 = (fdb_kvs_handle *)0x112663;
    fVar5 = fdb_get(pfStack_1ac8,pfStack_1ae0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127f1;
    pfStack_1b08 = (fdb_kvs_handle *)0x11267a;
    fVar5 = fdb_get(pfStack_1ad0,pfStack_1ae0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127f6;
    pfStack_1b08 = (fdb_kvs_handle *)0x112691;
    fVar5 = fdb_get(pfStack_1ad8,pfStack_1ae0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001127fb;
    pfStack_1b08 = (fdb_kvs_handle *)0x1126a3;
    fdb_doc_free(pfStack_1ae0);
    pfStack_1b08 = (fdb_kvs_handle *)0x1126b7;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ab0,1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112800;
    pfStack_1b08 = (fdb_kvs_handle *)0x1126d3;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ab8,2);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112805;
    pfStack_1b08 = (fdb_kvs_handle *)0x1126ef;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ac0,3);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011280a;
    pfStack_1b08 = (fdb_kvs_handle *)0x112701;
    fdb_kvs_close(pfStack_1ac8);
    pfStack_1b08 = (fdb_kvs_handle *)0x11270b;
    fdb_kvs_close(pfStack_1ad0);
    pfStack_1b08 = (fdb_kvs_handle *)0x112715;
    fdb_kvs_close(pfStack_1ad8);
    pfStack_1b08 = (fdb_kvs_handle *)0x112724;
    fVar5 = fdb_commit(pfStack_1af0,'\x01');
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1b08 = (fdb_kvs_handle *)0x112736;
      fdb_kvs_close(pfStack_1ab0);
      pfStack_1b08 = (fdb_kvs_handle *)0x112740;
      fdb_kvs_close(pfStack_1ab8);
      pfStack_1b08 = (fdb_kvs_handle *)0x11274a;
      fdb_kvs_close(pfStack_1ac0);
      pfStack_1b08 = (fdb_kvs_handle *)0x112754;
      fdb_kvs_close(pfStack_1af8);
      pfStack_1b08 = (fdb_kvs_handle *)0x11275e;
      fdb_close(pfStack_1af0);
      pfStack_1b08 = (fdb_kvs_handle *)0x112768;
      fdb_doc_free((fdb_doc *)aStack_1ae8.seqtree);
      pfStack_1b08 = (fdb_kvs_handle *)0x11276d;
      fdb_shutdown();
      pfStack_1b08 = (fdb_kvs_handle *)0x112772;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_1b08 = (fdb_kvs_handle *)0x1127a3;
      fprintf(_stderr,pcVar21,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_1b08 = (fdb_kvs_handle *)0x1127ba;
    in_memory_snapshot_cleanup_test();
LAB_001127ba:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127bf;
    in_memory_snapshot_cleanup_test();
LAB_001127bf:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127c4;
    in_memory_snapshot_cleanup_test();
LAB_001127c4:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127c9;
    in_memory_snapshot_cleanup_test();
LAB_001127c9:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127ce;
    in_memory_snapshot_cleanup_test();
LAB_001127ce:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127d3;
    in_memory_snapshot_cleanup_test();
LAB_001127d3:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127d8;
    in_memory_snapshot_cleanup_test();
LAB_001127d8:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127dd;
    in_memory_snapshot_cleanup_test();
LAB_001127dd:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127e2;
    in_memory_snapshot_cleanup_test();
LAB_001127e2:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127e7;
    in_memory_snapshot_cleanup_test();
LAB_001127e7:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127ec;
    in_memory_snapshot_cleanup_test();
LAB_001127ec:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127f1;
    in_memory_snapshot_cleanup_test();
LAB_001127f1:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127f6;
    in_memory_snapshot_cleanup_test();
LAB_001127f6:
    pfStack_1b08 = (fdb_kvs_handle *)0x1127fb;
    in_memory_snapshot_cleanup_test();
LAB_001127fb:
    pfStack_1b08 = (fdb_kvs_handle *)0x112800;
    in_memory_snapshot_cleanup_test();
LAB_00112800:
    pfStack_1b08 = (fdb_kvs_handle *)0x112805;
    in_memory_snapshot_cleanup_test();
LAB_00112805:
    pfStack_1b08 = (fdb_kvs_handle *)0x11280a;
    in_memory_snapshot_cleanup_test();
LAB_0011280a:
    pfStack_1b08 = (fdb_kvs_handle *)0x11280f;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_1b08 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_1ed0 = (fdb_kvs_handle *)0x112834;
  paStack_1b30 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar16;
  pfStack_1b28 = (fdb_kvs_handle *)pcVar21;
  pfStack_1b20 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1b18 = pfVar17;
  pfStack_1b10 = (fdb_kvs_handle *)handle_00;
  pfStack_1b08 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_1e48,(__timezone_ptr_t)0x0);
  pfStack_1c38 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_1c30,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1ed0 = (fdb_kvs_handle *)0x11285c;
  system((char *)&pfStack_1c38);
  pfStack_1ed0 = (fdb_kvs_handle *)0x112861;
  memleak_start();
  pfStack_1ed0 = (fdb_kvs_handle *)0x11286b;
  pfVar17 = (fdb_kvs_handle *)malloc(0x20);
  pcVar16 = auStack_1e38 + 0x108;
  pfStack_1ed0 = (fdb_kvs_handle *)0x11287e;
  fdb_get_default_config();
  uStack_1d10._0_1_ = true;
  uStack_1d10._1_1_ = true;
  uStack_1d18 = '\x01';
  pcStack_1d20 = (char *)0x3c;
  uStack_1cf0 = 1;
  sStack_1d28 = 0;
  pfStack_1ed0 = (fdb_kvs_handle *)0x1128a9;
  fdb_get_default_kvs_config();
  pfStack_1ed0 = (fdb_kvs_handle *)0x1128bd;
  fVar5 = fdb_open(&pfStack_1e80,"./mvcc_test",(fdb_config *)pcVar16);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = auStack_1e68 + 8;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1128e0;
    fVar5 = fdb_kvs_open(pfStack_1e80,&pfStack_1e98,"db",(fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d7;
    puStack_1ea0 = (undefined4 *)((long)&pfVar17->kvs + 2);
    pcVar16 = "k%05d";
    handle_00 = auStack_1e38;
    pcVar21 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1ed0 = (fdb_kvs_handle *)0x11291b;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112949;
      sprintf((char *)pfVar17,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_1e98;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112956;
      sVar8 = strlen(handle_00);
      pfStack_1ed0 = (fdb_kvs_handle *)0x11296e;
      in_RCX = (char *)pfVar17;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar8 + 1,pfVar17,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113057;
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 0x1e);
    pfStack_1ed0 = (fdb_kvs_handle *)0x11298c;
    fVar5 = fdb_commit(pfStack_1e80,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130dc;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1129aa;
    fVar5 = fdb_snapshot_open(pfStack_1e98,&pfStack_1ea8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130e1;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1129c8;
    fVar5 = fdb_snapshot_open(pfStack_1ea8,&pfStack_1e90,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130e6;
    handle._M_i = 0x1e;
    handle_00 = auStack_1e38;
    pcVar21 = "value%08d";
    do {
      pfStack_1ed0 = (fdb_kvs_handle *)0x1129fa;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112a28;
      sprintf((char *)pfVar17,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_1e98;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112a35;
      sVar8 = strlen(handle_00);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112a4d;
      in_RCX = (char *)pfVar17;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar8 + 1,pfVar17,0x20);
      pfVar12 = (fdb_kvs_handle *)"k%05d";
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011305c;
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 300);
    pfStack_1ed0 = (fdb_kvs_handle *)0x112a7d;
    sprintf((char *)auStack_1e38,"k%05d",0x1e);
    handle_00 = (char *)pfStack_1ea8;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112a8a;
    sVar8 = strlen((char *)auStack_1e38);
    in_RCX = auStack_1e68;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112aa3;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)handle_00,(fdb_kvs_handle *)auStack_1e38,sVar8 + 1,
                       (void **)in_RCX,&sStack_1e70);
    pfVar12 = pfStack_1e90;
    pcVar16 = (char *)auStack_1e38;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001130eb;
    handle_00 = auStack_1e38;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ac0;
    sVar8 = strlen(handle_00);
    in_RCX = auStack_1e68;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ad9;
    fVar5 = fdb_get_kv(pfVar12,handle_00,sVar8 + 1,(void **)in_RCX,&sStack_1e70);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001130f0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112aeb;
    fVar5 = fdb_kvs_close(pfStack_1ea8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130f5;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112afd;
    fVar5 = fdb_kvs_close(pfStack_1e90);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130fa;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112b1b;
    fVar5 = fdb_snapshot_open(pfStack_1e98,&pfStack_1ea8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130ff;
    in_RCX = (char *)0x0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112b43;
    fVar5 = fdb_iterator_init(pfStack_1ea8,&pfStack_1eb0,(void *)0x0,0,(void *)0x0,0,0);
    pcVar16 = (char *)pfVar12;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113104;
    pcVar21 = auStack_1e38;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1ec0 = (fdb_kvs_handle *)0x0;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112b74;
      fVar5 = fdb_iterator_get(pfStack_1eb0,(fdb_doc **)&pfStack_1ec0);
      pcVar16 = (char *)pfVar12;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112b8f;
      sprintf(pcVar21,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112bbd;
      sprintf((char *)pfVar17,"value%08d",handle._M_i);
      pfVar12 = pfStack_1ec0;
      handle_00 = (char *)pfStack_1ec0->op_stats;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112bd4;
      iVar6 = bcmp(handle_00,pcVar21,*(size_t *)&pfStack_1ec0->kvs_config);
      if (iVar6 != 0) goto LAB_00113061;
      handle_00 = (char *)(pfVar12->field_6).seqtree;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112bef;
      iVar6 = bcmp(handle_00,pfVar17,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00113071;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112c01;
      fdb_doc_free((fdb_doc *)pfVar12);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112c0b;
      fVar5 = fdb_iterator_next(pfStack_1eb0);
      pcVar16 = (char *)pfVar12;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_00113109;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112c29;
    fVar5 = fdb_iterator_close(pfStack_1eb0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011310e;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112c47;
    fVar5 = fdb_snapshot_open(pfStack_1ea8,&pfStack_1e90,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113113;
    in_RCX = (char *)0x0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112c6f;
    fVar5 = fdb_iterator_init(pfStack_1ea8,&pfStack_1eb0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113118;
    in_RCX = (char *)0x0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112c97;
    fVar5 = fdb_iterator_init(pfStack_1e90,&pfStack_1e78,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011311d;
    in_RCX = (char *)0x0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112cbf;
    fVar5 = fdb_iterator_init(pfStack_1e98,&pfStack_1e88,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113122;
    pcVar21 = auStack_1e38;
    unaff_R13 = "value%08d";
    handle_00 = "k%06d";
    uStack_1eb4 = 0;
    do {
      pfStack_1ec0 = (fdb_kvs_handle *)0x0;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112cfd;
      fVar5 = fdb_iterator_get(pfStack_1eb0,(fdb_doc **)&pfStack_1ec0);
      uVar19 = uStack_1eb4;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112ea7;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112d1c;
      sprintf(pcVar21,"k%05d",(ulong)uStack_1eb4);
      *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar17->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112d4a;
      sprintf((char *)pfVar17,"value%08d",(ulong)uVar19);
      pfVar12 = pfStack_1ec0;
      handle._M_i = (__int_type)pfStack_1ec0->op_stats;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112d61;
      iVar6 = bcmp((void *)handle._M_i,pcVar21,*(size_t *)&pfStack_1ec0->kvs_config);
      if (iVar6 != 0) goto LAB_0011307c;
      handle._M_i = (__int_type)(pfVar12->field_6).seqtree;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112d7c;
      iVar6 = bcmp((void *)handle._M_i,pfVar17,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      pcVar16 = (char *)pfVar12;
      if (iVar6 != 0) goto LAB_001130ac;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112d8c;
      fdb_doc_free((fdb_doc *)pfVar12);
      pfStack_1ec0 = (fdb_kvs_handle *)0x0;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112da4;
      fVar5 = fdb_iterator_get(pfStack_1eb0,(fdb_doc **)&pfStack_1ec0);
      pcVar16 = (char *)pfStack_1ec0;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011308c;
      handle._M_i = (__int_type)pfStack_1ec0->op_stats;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112dc3;
      iVar6 = bcmp((void *)handle._M_i,pcVar21,*(size_t *)&pfStack_1ec0->kvs_config);
      if (iVar6 != 0) goto LAB_00113091;
      handle._M_i = (__int_type)(((fdb_kvs_handle *)pcVar16)->field_6).seqtree;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112dde;
      iVar6 = bcmp((void *)handle._M_i,pfVar17,
                   (size_t)(((fdb_kvs_handle *)pcVar16)->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_001130a1;
      uVar19 = uStack_1eb4 + 1;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112df4;
      fdb_doc_free((fdb_doc *)pcVar16);
      uStack_1eb4 = uVar19;
      if (uVar19 == 0x3c) {
        pcVar16 = (char *)0x0;
        do {
          pfStack_1ed0 = (fdb_kvs_handle *)0x112e10;
          sprintf(pcVar21,"k%06d",pcVar16);
          *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
          *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
          *(undefined4 *)&(pfVar17->kvs_config).custom_cmp = 0x78787878;
          *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 4) = 0x78787878;
          *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 2) = 0x78787878;
          *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 6) = 0x78787878;
          *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 2) = 0x78787878;
          *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 6) = 0x78787878;
          *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
          *puStack_1ea0 = 0x646e653c;
          pfStack_1ed0 = (fdb_kvs_handle *)0x112e3f;
          sprintf((char *)pfVar17,"value%08d",pcVar16);
          handle._M_i = (__int_type)pfStack_1e98;
          pfStack_1ed0 = (fdb_kvs_handle *)0x112e4c;
          sVar8 = strlen(pcVar21);
          pfStack_1ed0 = (fdb_kvs_handle *)0x112e64;
          in_RCX = (char *)pfVar17;
          fVar5 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar21,sVar8 + 1,pfVar17,0x20);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfStack_1ed0 = (fdb_kvs_handle *)0x113057;
            in_memory_snapshot_on_dirty_hbtrie_test();
            goto LAB_00113057;
          }
          uVar19 = (int)pcVar16 + 1;
          pcVar16 = (char *)(ulong)uVar19;
        } while (uVar19 != 3000);
      }
      pfStack_1ed0 = (fdb_kvs_handle *)0x112e82;
      fVar7 = fdb_iterator_next(pfStack_1eb0);
      handle._M_i = (__int_type)(uint)fVar7;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112e8e;
      fVar5 = fdb_iterator_next(pfStack_1e78);
      if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00112e9f;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    pfStack_1ed0 = (fdb_kvs_handle *)0x112e9f;
    in_memory_snapshot_on_dirty_hbtrie_test();
    fVar5 = extraout_EAX;
LAB_00112e9f:
    if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00112ea7:
      if (uStack_1eb4 != 300) goto LAB_00113127;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112ebf;
      fVar5 = fdb_iterator_close(pfStack_1eb0);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011312c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112ed1;
      fVar5 = fdb_iterator_close(pfStack_1e78);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113131;
      pcVar21 = auStack_1e38;
      unaff_R13 = "value%08d";
      handle._M_i = 0;
      do {
        pfStack_1ec0 = (fdb_kvs_handle *)0x0;
        pfStack_1ed0 = (fdb_kvs_handle *)0x112f02;
        fVar5 = fdb_iterator_get(pfStack_1e88,(fdb_doc **)&pfStack_1ec0);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfStack_1ed0 = (fdb_kvs_handle *)0x112f1d;
        sprintf(pcVar21,"k%05d",handle._M_i);
        *(undefined4 *)&pfVar17->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar17->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar17->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar17->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
        *puStack_1ea0 = 0x646e653c;
        pfStack_1ed0 = (fdb_kvs_handle *)0x112f4b;
        sprintf((char *)pfVar17,"value%08d",handle._M_i);
        pcVar16 = (char *)pfStack_1ec0;
        handle_00 = (char *)pfStack_1ec0->op_stats;
        pfStack_1ed0 = (fdb_kvs_handle *)0x112f62;
        iVar6 = bcmp(handle_00,pcVar21,*(size_t *)&pfStack_1ec0->kvs_config);
        if (iVar6 != 0) goto LAB_001130b7;
        handle_00 = (char *)(((fdb_kvs_handle *)pcVar16)->field_6).seqtree;
        pfStack_1ed0 = (fdb_kvs_handle *)0x112f7d;
        iVar6 = bcmp(handle_00,pfVar17,
                     (size_t)(((fdb_kvs_handle *)pcVar16)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_001130c7;
        handle._M_i = (__int_type)((int)handle._M_i + 1);
        pfStack_1ed0 = (fdb_kvs_handle *)0x112f8f;
        fdb_doc_free((fdb_doc *)pcVar16);
        pfStack_1ed0 = (fdb_kvs_handle *)0x112f99;
        fVar5 = fdb_iterator_next(pfStack_1e88);
      } while (fVar5 == FDB_RESULT_SUCCESS);
      if ((int)handle._M_i != 300) goto LAB_00113136;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112fb7;
      fVar5 = fdb_iterator_close(pfStack_1e88);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011313b;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112fc9;
      fVar5 = fdb_kvs_close(pfStack_1ea8);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113140;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112fdb;
      fVar5 = fdb_kvs_close(pfStack_1e90);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113145;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112fed;
      fVar5 = fdb_close(pfStack_1e80);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011314a;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112ffa;
      fVar5 = fdb_shutdown();
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pfStack_1ed0 = (fdb_kvs_handle *)0x11300a;
        free(pfVar17);
        pfStack_1ed0 = (fdb_kvs_handle *)0x11300f;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pfStack_1ed0 = (fdb_kvs_handle *)0x113040;
        fprintf(_stderr,pcVar21,"in-memory snapshot on dirty HB+trie nodes test");
        return;
      }
      goto LAB_0011314f;
    }
  }
  else {
LAB_001130d2:
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130d7;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130d7:
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130dc;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130dc:
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130e1;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e1:
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130e6;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130e6:
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130eb;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130eb:
    pfVar12 = (fdb_kvs_handle *)pcVar16;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130f0;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f0:
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130f5;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130f5:
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130fa;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130fa:
    pfStack_1ed0 = (fdb_kvs_handle *)0x1130ff;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_001130ff:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113104;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pcVar16 = (char *)pfVar12;
LAB_00113104:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113109;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113109:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11310e;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011310e:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113113;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113113:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113118;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113118:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11311d;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011311d:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113122;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113122:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113127;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113127:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11312c;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011312c:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113131;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113131:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113136;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113136:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11313b;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011313b:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113140;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113140:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113145;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113145:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11314a;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314a:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11314f;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011314f:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113154;
    in_memory_snapshot_on_dirty_hbtrie_test();
  }
  pfStack_1ed0 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_22e8 = (fdb_kvs_handle *)0x113179;
  pfStack_1ef8 = pfVar17;
  pfStack_1ef0 = (fdb_kvs_handle *)pcVar21;
  pfStack_1ee8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1ee0 = (fdb_kvs_handle *)pcVar16;
  pfStack_1ed8 = (fdb_kvs_handle *)handle_00;
  pfStack_1ed0 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_2210,(__timezone_ptr_t)0x0);
  auStack_22d8._4_2_ = 100;
  auStack_22d8._0_4_ = 0x3530256b;
  auStack_22b0._8_2_ = 100;
  auStack_22b0._0_8_ = 0x38302565756c6176;
  builtin_strncpy(acStack_1ff8,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_2000 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_22e8 = (fdb_kvs_handle *)0x1131c6;
  system((char *)&pfStack_2000);
  pfStack_22e8 = (fdb_kvs_handle *)0x1131cb;
  memleak_start();
  pfStack_22e8 = (fdb_kvs_handle *)0x1131d5;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pfVar17 = (fdb_kvs_handle *)((long)apbStack_2200 + 0x108);
  pfStack_22e8 = (fdb_kvs_handle *)0x1131e8;
  fdb_get_default_config();
  uStack_20d8 = 0x201;
  auStack_20f8[0x18] = '\x01';
  auStack_20f8._16_8_ = (fdb_txn *)0x2;
  uStack_20b8 = 1;
  auStack_20f8._8_8_ = (fdb_log_callback)0x0;
  pcStack_20a0 = cb_inmem_snap;
  uStack_2098 = 2;
  pfStack_2090 = (fdb_txn *)auStack_2280;
  pfStack_22e8 = (fdb_kvs_handle *)0x113232;
  fdb_get_default_kvs_config();
  pfStack_22e8 = (fdb_kvs_handle *)0x113246;
  fVar5 = fdb_open(&pfStack_22d0,"./mvcc_test",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = auStack_2280 + 0x28;
    pfStack_22e8 = (fdb_kvs_handle *)0x11326c;
    fVar5 = fdb_kvs_open(pfStack_22d0,(fdb_kvs_handle **)(auStack_22b0 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011364f;
    in_RCX = auStack_2280 + 0x28;
    pfStack_22e8 = (fdb_kvs_handle *)0x113292;
    fVar5 = fdb_kvs_open(pfStack_22d0,(fdb_kvs_handle **)(auStack_22b0 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113654;
    auStack_2280._0_8_ = auStack_22b0._24_8_;
    auStack_2280._8_8_ = (btree *)0xa;
    auStack_2280._24_8_ = auStack_22d8;
    handle_00 = auStack_22b0;
    auStack_2280._16_4_ = 0x20;
    pfVar17 = (fdb_kvs_handle *)((long)&pfVar12->kvs + 2);
    pcVar21 = (char *)apbStack_2200;
    handle._M_i = 0;
    auStack_2280._32_8_ = handle_00;
    do {
      pfStack_22e8 = (fdb_kvs_handle *)0x1132ee;
      sprintf(pcVar21,auStack_22d8,handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
      *(undefined2 *)((long)&pfVar12->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
      pfStack_22e8 = (fdb_kvs_handle *)0x113319;
      sprintf((char *)pfVar12,handle_00,handle._M_i);
      unaff_R13 = (char *)auStack_22b0._16_8_;
      pfStack_22e8 = (fdb_kvs_handle *)0x113326;
      sVar8 = strlen(pcVar21);
      pfStack_22e8 = (fdb_kvs_handle *)0x11333e;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar21,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_22e8 = (fdb_kvs_handle *)0x113614;
        in_memory_snapshot_compaction_test();
        goto LAB_00113614;
      }
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 10);
    pfStack_22e8 = (fdb_kvs_handle *)0x11335c;
    fVar5 = fdb_commit(pfStack_22d0,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113659;
    pfStack_22e8 = (fdb_kvs_handle *)0x113375;
    fVar5 = fdb_compact(pfStack_22d0,"./mvcc_test2");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011365e;
    pfStack_22e8 = (fdb_kvs_handle *)0x113393;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_22b0._16_8_,&pfStack_22c8,0xffffffffffffffff
                             );
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113663;
    pfStack_22e8 = (fdb_kvs_handle *)0x1133ad;
    fVar5 = fdb_get_kvs_info(pfStack_22c8,(fdb_kvs_info *)&phStack_2240);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113668;
    if (pkStack_2238 != (kvs_ops_stat *)0xb) {
      pfStack_22e8 = (fdb_kvs_handle *)0x1133cd;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (char *)0x0;
    pfStack_22e8 = (fdb_kvs_handle *)0x1133ed;
    fVar5 = fdb_iterator_init(pfStack_22c8,&pfStack_22b8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar23 = (fdb_kvs_handle *)pcVar21;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011366d;
    handle_00 = (char *)apbStack_2200;
    handle._M_i = 0;
    do {
      pfStack_22c0 = (fdb_kvs_handle *)0x0;
      pfStack_22e8 = (fdb_kvs_handle *)0x113417;
      fVar5 = fdb_iterator_get(pfStack_22b8,(fdb_doc **)&pfStack_22c0);
      pcVar21 = (char *)pfStack_22c0;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((uint)handle._M_i < 10) {
        pfStack_22e8 = (fdb_kvs_handle *)0x113435;
        sprintf(handle_00,auStack_22d8,handle._M_i);
        *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 6) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 2) = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 6) = 0x78787878;
        *(undefined2 *)((long)&pfVar12->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
        pfStack_22e8 = (fdb_kvs_handle *)0x113462;
        sprintf((char *)pfVar12,auStack_22b0,handle._M_i);
        pcVar21 = (char *)pfStack_22c0;
        unaff_R13 = (char *)pfStack_22c0->op_stats;
        pfStack_22e8 = (fdb_kvs_handle *)0x11347b;
        iVar6 = bcmp(unaff_R13,handle_00,(size_t)*(fdb_kvs_handle **)&pfStack_22c0->kvs_config);
        if (iVar6 != 0) goto LAB_0011362f;
        unaff_R13 = (char *)(((fdb_kvs_handle *)pcVar21)->field_6).seqtree;
        pfStack_22e8 = (fdb_kvs_handle *)0x113498;
        iVar6 = bcmp(unaff_R13,pfVar12,
                     (size_t)(((fdb_kvs_handle *)pcVar21)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_0011363f;
      }
      else {
        apbStack_2200[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(fdb_kvs_handle **)&pfVar12->kvs_config = (fdb_kvs_handle *)0x756c61765f77656e;
        *(undefined2 *)&(pfVar12->kvs_config).custom_cmp = 0x65;
        unaff_R13 = (char *)pfStack_22c0->op_stats;
        pfStack_22e8 = (fdb_kvs_handle *)0x1134df;
        iVar6 = bcmp(unaff_R13,handle_00,(size_t)*(fdb_kvs_handle **)&pfStack_22c0->kvs_config);
        if (iVar6 != 0) goto LAB_00113614;
        unaff_R13 = (char *)(((fdb_kvs_handle *)pcVar21)->field_6).seqtree;
        pfStack_22e8 = (fdb_kvs_handle *)0x1134fc;
        iVar6 = bcmp(unaff_R13,pfVar12,
                     (size_t)(((fdb_kvs_handle *)pcVar21)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113624;
      }
      handle._M_i = (__int_type)((uint)handle._M_i + 1);
      pfStack_22e8 = (fdb_kvs_handle *)0x11350e;
      fdb_doc_free((fdb_doc *)pcVar21);
      pfStack_22e8 = (fdb_kvs_handle *)0x113518;
      fVar5 = fdb_iterator_next(pfStack_22b8);
      pfVar23 = (fdb_kvs_handle *)pcVar21;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 0xb) goto LAB_00113672;
    pfStack_22e8 = (fdb_kvs_handle *)0x113533;
    fVar5 = fdb_iterator_close(pfStack_22b8);
    pfVar14 = pfStack_22c8;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113677;
    handle_00 = (char *)apbStack_2200;
    pfStack_22e8 = (fdb_kvs_handle *)0x113550;
    sVar8 = strlen(handle_00);
    in_RCX = auStack_22b0 + 0x28;
    pfStack_22e8 = (fdb_kvs_handle *)0x113569;
    fVar5 = fdb_get_kv(pfVar14,handle_00,sVar8 + 1,(void **)in_RCX,(size_t *)(auStack_22b0 + 0x20));
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011367c;
    pfStack_22e8 = (fdb_kvs_handle *)0x113586;
    pfVar17 = pfVar12;
    iVar6 = bcmp((void *)auStack_22b0._40_8_,pfVar12,auStack_22b0._32_8_);
    pfVar14 = (fdb_kvs_handle *)auStack_22b0._40_8_;
    if (iVar6 != 0) goto LAB_00113681;
    pfStack_22e8 = (fdb_kvs_handle *)0x113596;
    fdb_free_block((void *)auStack_22b0._40_8_);
    pfStack_22e8 = (fdb_kvs_handle *)0x1135a0;
    fdb_kvs_close(pfStack_22c8);
    pfStack_22e8 = (fdb_kvs_handle *)0x1135aa;
    fVar5 = fdb_close(pfStack_22d0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011368c;
    pfStack_22e8 = (fdb_kvs_handle *)0x1135b7;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_22e8 = (fdb_kvs_handle *)0x1135c7;
      free(pfVar12);
      pfStack_22e8 = (fdb_kvs_handle *)0x1135cc;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_22e8 = (fdb_kvs_handle *)0x1135fd;
      fprintf(_stderr,pcVar21,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011364a:
    pfStack_22e8 = (fdb_kvs_handle *)0x11364f;
    in_memory_snapshot_compaction_test();
LAB_0011364f:
    pfStack_22e8 = (fdb_kvs_handle *)0x113654;
    in_memory_snapshot_compaction_test();
LAB_00113654:
    pfStack_22e8 = (fdb_kvs_handle *)0x113659;
    in_memory_snapshot_compaction_test();
LAB_00113659:
    pfStack_22e8 = (fdb_kvs_handle *)0x11365e;
    in_memory_snapshot_compaction_test();
LAB_0011365e:
    pfStack_22e8 = (fdb_kvs_handle *)0x113663;
    in_memory_snapshot_compaction_test();
LAB_00113663:
    pfStack_22e8 = (fdb_kvs_handle *)0x113668;
    in_memory_snapshot_compaction_test();
LAB_00113668:
    pfStack_22e8 = (fdb_kvs_handle *)0x11366d;
    in_memory_snapshot_compaction_test();
    pfVar23 = (fdb_kvs_handle *)pcVar21;
LAB_0011366d:
    pfStack_22e8 = (fdb_kvs_handle *)0x113672;
    in_memory_snapshot_compaction_test();
LAB_00113672:
    pfStack_22e8 = (fdb_kvs_handle *)0x113677;
    in_memory_snapshot_compaction_test();
LAB_00113677:
    pfVar14 = pfVar17;
    pfStack_22e8 = (fdb_kvs_handle *)0x11367c;
    in_memory_snapshot_compaction_test();
LAB_0011367c:
    pfStack_22e8 = (fdb_kvs_handle *)0x113681;
    in_memory_snapshot_compaction_test();
LAB_00113681:
    pfStack_22e8 = (fdb_kvs_handle *)0x11368c;
    pfVar17 = pfVar14;
    in_memory_snapshot_compaction_test();
LAB_0011368c:
    pfStack_22e8 = (fdb_kvs_handle *)0x113691;
    in_memory_snapshot_compaction_test();
  }
  pfStack_22e8 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar24 = (ulong)pfVar17 & 0xffffffff;
  _Var13._M_i = 0;
  pcStack_25a0 = (code *)0x1136be;
  pfStack_2310 = pfVar12;
  pfStack_2308 = pfVar23;
  pfStack_2300 = (fdb_kvs_handle *)unaff_R13;
  pfStack_22f8 = pfVar14;
  pfStack_22f0 = (fdb_kvs_handle *)handle_00;
  pfStack_22e8 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)auStack_2528,(__timezone_ptr_t)0x0);
  if ((int)pfVar17 != 2) {
    return;
  }
  __s_01 = extraout_RDX;
  if (extraout_RDX == (btree *)0x0) {
LAB_00113be0:
    pcStack_25a0 = (code *)0x113be5;
    cb_inmem_snap();
LAB_00113be5:
    pcStack_25a0 = (code *)0x113bea;
    cb_inmem_snap();
LAB_00113bea:
    pcStack_25a0 = (code *)0x113bef;
    cb_inmem_snap();
LAB_00113bef:
    pcStack_25a0 = (code *)0x113bf4;
    cb_inmem_snap();
LAB_00113bf4:
    pcStack_25a0 = (code *)0x113bf9;
    cb_inmem_snap();
LAB_00113bf9:
    pcStack_25a0 = (code *)0x113bfe;
    cb_inmem_snap();
LAB_00113bfe:
    pcStack_25a0 = (code *)0x113c03;
    cb_inmem_snap();
    pfVar17 = (fdb_kvs_handle *)unaff_R13;
LAB_00113c03:
    pcStack_25a0 = (code *)0x113c08;
    cb_inmem_snap();
LAB_00113c08:
    pfVar12 = (fdb_kvs_handle *)in_RCX;
    pcStack_25a0 = (code *)0x113c0d;
    cb_inmem_snap();
LAB_00113c0d:
    pcStack_25a0 = (code *)0x113c12;
    cb_inmem_snap();
  }
  else {
    unaff_R13 = (char *)CONCAT26(auStack_22d8._6_2_,CONCAT24(auStack_22d8._4_2_,auStack_22d8._0_4_))
    ;
    pfVar17 = (fdb_kvs_handle *)(ulong)*(byte *)&((fdb_kvs_handle *)in_RCX)->file;
    iVar6 = *(int *)((long)&(((atomic<unsigned_long> *)
                             &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                            super___atomic_base<unsigned_long>)._M_i + 4);
    *(int *)((long)&(((atomic<unsigned_long> *)
                     &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                    super___atomic_base<unsigned_long>)._M_i + 4) = iVar6 + 1;
    if (iVar6 != 4) {
      if (iVar6 != 1) {
        return;
      }
      pcStack_25a0 = (code *)0x11370e;
      fVar5 = fdb_snapshot_open((fdb_kvs_handle *)
                                *(__atomic_base<unsigned_long> *)
                                 &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_2588,
                                0xffffffffffffffff);
      _Var13._M_i = (__int_type)pfVar17;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113be5;
      pcStack_25a0 = (code *)0x113725;
      fVar5 = fdb_get_kvs_info(pfStack_2588,&fStack_2558);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bef;
      in_RCX = (char *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
      if (fStack_2558.last_seqnum !=
          (long)(int)(((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                     super___atomic_base<unsigned_long>)._M_i) {
        pcStack_25a0 = (code *)0x113b4e;
        cb_inmem_snap();
      }
      pcStack_25a0 = (code *)0x11376a;
      pfStack_2578 = pfVar17;
      paStack_2570 = (atomic<unsigned_long> *)in_RCX;
      fVar5 = fdb_iterator_init(pfStack_2588,&pfStack_2590,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        __s_01 = (btree *)(auStack_2528 + 10);
        uVar24 = 0;
        do {
          pfStack_2580 = (fdb_kvs_handle *)0x0;
          pcStack_25a0 = (code *)0x1137a1;
          fVar5 = fdb_iterator_get(pfStack_2590,(fdb_doc **)&pfStack_2580);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
          lVar18 = CONCAT26(auStack_22d8._6_2_,CONCAT24(auStack_22d8._4_2_,auStack_22d8._0_4_));
          pcStack_25a0 = (code *)0x1137c1;
          sprintf(auStack_2518 + 0x100,*(char **)(lVar18 + 0x18),uVar24);
          sVar8 = (size_t)*(int *)(lVar18 + 0x10);
          pcStack_25a0 = (code *)0x1137d5;
          memset(auStack_2518,0x78,sVar8);
          *(undefined4 *)(&__s_01->ksize + sVar8) = 0x646e653c;
          *(undefined2 *)((long)&uStack_251a + sVar8) = 0x3e;
          pcStack_25a0 = (code *)0x1137f5;
          sprintf(auStack_2518,*(char **)(lVar18 + 0x20),uVar24);
          unaff_R13 = (char *)pfStack_2580;
          in_RCX = (char *)pfStack_2580->op_stats;
          pcStack_25a0 = (code *)0x11380d;
          iVar6 = bcmp(in_RCX,auStack_2518 + 0x100,*(size_t *)&pfStack_2580->kvs_config);
          if (iVar6 != 0) {
            pcStack_25a0 = (code *)0x113b90;
            cb_inmem_snap();
LAB_00113b90:
            pcStack_25a0 = (code *)0x113ba0;
            cb_inmem_snap();
            goto LAB_00113ba0;
          }
          in_RCX = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
          pcStack_25a0 = (code *)0x113828;
          iVar6 = bcmp(in_RCX,auStack_2518,
                       (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
          if (iVar6 != 0) goto LAB_00113b90;
          uVar24 = (ulong)((int)uVar24 + 1);
          pcStack_25a0 = (code *)0x11383a;
          fdb_doc_free((fdb_doc *)unaff_R13);
          pcStack_25a0 = (code *)0x113844;
          fVar5 = fdb_iterator_next(pfStack_2590);
        } while (fVar5 == FDB_RESULT_SUCCESS);
        if ((int)uVar24 != (int)(paStack_2570->super___atomic_base<unsigned_long>)._M_i) {
          pcStack_25a0 = (code *)0x113b6c;
          cb_inmem_snap();
        }
        pcStack_25a0 = (code *)0x113863;
        fVar5 = fdb_iterator_close(pfStack_2590);
        pfVar17 = pfStack_2578;
        if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00113b21;
        pcStack_25a0 = (code *)0x113875;
        cb_inmem_snap();
        goto LAB_00113875;
      }
      goto LAB_00113bf9;
    }
LAB_00113875:
    in_RCX = auStack_2518 + 0x100;
    auStack_2518._256_4_ = 0x5f77656e;
    auStack_2518[0x104] = 'k';
    auStack_2518[0x105] = 'e';
    auStack_2518[0x106] = 'y';
    auStack_2518[0x107] = '\0';
    __s_01 = (btree *)auStack_2518;
    auStack_2518[0] = 'n';
    auStack_2518[1] = 'e';
    auStack_2518._2_2_ = 0x5f77;
    auStack_2518._4_4_ = 0x756c6176;
    auStack_2518._8_2_ = 0x65;
    _Var13._M_i = *(__int_type *)&((fdb_kvs_handle *)unaff_R13)->kvs_config;
    pcStack_25a0 = (code *)0x1138b7;
    pfStack_2578 = pfVar17;
    sVar8 = strlen(in_RCX);
    pfVar23 = (fdb_kvs_handle *)(sVar8 + 1);
    pcStack_25a0 = (code *)0x1138c3;
    sVar8 = strlen((char *)__s_01);
    pcStack_25a0 = (code *)0x1138d8;
    fVar5 = fdb_set_kv((fdb_kvs_handle *)_Var13._M_i,in_RCX,(size_t)pfVar23,__s_01,sVar8 + 1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bea;
    pcStack_25a0 = (code *)0x1138f5;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)
                              *(__atomic_base<unsigned_long> *)
                               &((fdb_kvs_handle *)unaff_R13)->kvs_config,&pfStack_2588,
                              0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bf4;
    pcStack_25a0 = (code *)0x11390c;
    fVar5 = fdb_get_kvs_info(pfStack_2588,&fStack_2558);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113bfe;
    in_RCX = (char *)&(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp;
    if (fStack_2558.last_seqnum !=
        (long)(int)(((atomic<unsigned_long> *)
                    &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp)->
                   super___atomic_base<unsigned_long>)._M_i + 1U) {
      pcStack_25a0 = (code *)0x113b60;
      cb_inmem_snap();
    }
    pcStack_25a0 = (code *)0x11394a;
    fVar5 = fdb_iterator_init(pfStack_2588,&pfStack_2590,(void *)0x0,0,(void *)0x0,0,0);
    pfVar17 = (fdb_kvs_handle *)unaff_R13;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c03;
    pcVar21 = auStack_2518 + 0x100;
    pfVar23 = (fdb_kvs_handle *)auStack_2518;
    uVar24 = 0;
    do {
      pfStack_2580 = (fdb_kvs_handle *)0x0;
      pcStack_25a0 = (code *)0x11397c;
      fVar5 = fdb_iterator_get(pfStack_2590,(fdb_doc **)&pfStack_2580);
      unaff_R13 = (char *)pfStack_2580;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar24 <
          (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i) {
        lVar18 = CONCAT26(auStack_22d8._6_2_,CONCAT24(auStack_22d8._4_2_,auStack_22d8._0_4_));
        pcStack_25a0 = (code *)0x1139a4;
        sprintf(pcVar21,*(char **)(lVar18 + 0x18),uVar24);
        sVar8 = (size_t)*(int *)(lVar18 + 0x10);
        pcStack_25a0 = (code *)0x1139b8;
        memset(pfVar23,0x78,sVar8);
        *(undefined4 *)(auStack_2528 + sVar8 + 10) = 0x646e653c;
        *(undefined2 *)((long)&uStack_251a + sVar8) = 0x3e;
        pcStack_25a0 = (code *)0x1139dd;
        sprintf((char *)pfVar23,*(char **)(lVar18 + 0x20),uVar24);
        unaff_R13 = (char *)pfStack_2580;
        __s_01 = (btree *)(((atomic<unsigned_long> *)&pfStack_2580->op_stats)->
                          super___atomic_base<unsigned_long>)._M_i;
        pcStack_25a0 = (code *)0x1139f5;
        iVar6 = bcmp(__s_01,pcVar21,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_2580->kvs_config);
        if (iVar6 != 0) goto LAB_00113bb0;
        __s_01 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_25a0 = (code *)0x113a10;
        iVar6 = bcmp(__s_01,pfVar23,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar6 != 0) goto LAB_00113bc0;
      }
      else {
        auStack_2518._256_4_ = 0x5f77656e;
        auStack_2518[0x104] = 'k';
        auStack_2518[0x105] = 'e';
        auStack_2518[0x106] = 'y';
        auStack_2518[0x107] = '\0';
        auStack_2518[0] = 'n';
        auStack_2518[1] = 'e';
        auStack_2518._2_2_ = 0x5f77;
        auStack_2518._4_4_ = 0x756c6176;
        auStack_2518._8_2_ = 0x65;
        __s_01 = (btree *)(((atomic<unsigned_long> *)&pfStack_2580->op_stats)->
                          super___atomic_base<unsigned_long>)._M_i;
        pcStack_25a0 = (code *)0x113a5f;
        iVar6 = bcmp(__s_01,pcVar21,
                     (__int_type)*(__atomic_base<unsigned_long> *)&pfStack_2580->kvs_config);
        if (iVar6 != 0) goto LAB_00113bd0;
        __s_01 = (((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pcStack_25a0 = (code *)0x113a7a;
        iVar6 = bcmp(__s_01,pfVar23,
                     (((atomic<unsigned_long> *)
                      &(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param)->
                     super___atomic_base<unsigned_long>)._M_i);
        if (iVar6 != 0) goto LAB_00113ba0;
      }
      uVar24 = (ulong)((int)uVar24 + 1);
      pcStack_25a0 = (code *)0x113a8c;
      fdb_doc_free((fdb_doc *)unaff_R13);
      pcStack_25a0 = (code *)0x113a96;
      fVar5 = fdb_iterator_next(pfStack_2590);
      pfVar17 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)uVar24 !=
        (int)(((atomic<unsigned_long> *)in_RCX)->super___atomic_base<unsigned_long>)._M_i + 1) {
      pcStack_25a0 = (code *)0x113b7b;
      cb_inmem_snap();
    }
    pcStack_25a0 = (code *)0x113ab4;
    fVar5 = fdb_iterator_close(pfStack_2590);
    _Var13._M_i = (__int_type)pfStack_2578;
    pfVar12 = pfStack_2588;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c08;
    __s_01 = (btree *)(auStack_2518 + 0x100);
    pcStack_25a0 = (code *)0x113ad6;
    sVar8 = strlen((char *)__s_01);
    pcStack_25a0 = (code *)0x113aef;
    fVar5 = fdb_get_kv(pfVar12,__s_01,sVar8 + 1,&pfStack_2560,&sStack_2568);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113c0d;
    pcStack_25a0 = (code *)0x113b11;
    iVar6 = bcmp(pfStack_2560,auStack_2518,sStack_2568);
    pfVar12 = pfStack_2560;
    if (iVar6 == 0) {
      pcStack_25a0 = (code *)0x113b21;
      fdb_free_block(pfStack_2560);
LAB_00113b21:
      pcStack_25a0 = (code *)0x113b2b;
      fdb_kvs_close(pfStack_2588);
      return;
    }
  }
  pcStack_25a0 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_2b18 = (fdb_iterator *)0x113c42;
  fStack_27c0.bub_ctx.space_used = (uint64_t)pfVar12;
  fStack_27c0.bub_ctx.handle = pfVar23;
  pfStack_25b8 = pfVar17;
  pbStack_25b0 = __s_01;
  pfStack_25a8 = (fdb_kvs_handle *)_Var13._M_i;
  pcStack_25a0 = (code *)uVar24;
  gettimeofday(&tStack_29e8,(__timezone_ptr_t)0x0);
  pfStack_2b18 = (fdb_iterator *)0x113c47;
  memleak_start();
  pfStack_2b18 = (fdb_iterator *)0x113c56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar14 = (fdb_kvs_handle *)&fStack_27c0.config.encryption_key;
  pfStack_2b18 = (fdb_iterator *)0x113c66;
  fdb_get_default_config();
  config_00 = (fdb_iterator *)auStack_29d8;
  pfStack_2b18 = (fdb_iterator *)0x113c76;
  fdb_get_default_kvs_config();
  fStack_27c0.config.encryption_key.bytes[4] = '\0';
  fStack_27c0.config.encryption_key.bytes[5] = '\0';
  fStack_27c0.config.encryption_key.bytes[6] = '\0';
  fStack_27c0.config.encryption_key.bytes[7] = '\0';
  fStack_27c0.config.encryption_key.bytes[8] = '\0';
  fStack_27c0.config.encryption_key.bytes[9] = '\0';
  fStack_27c0.config.encryption_key.bytes[10] = '\0';
  fStack_27c0.config.encryption_key.bytes[0xb] = '\0';
  fStack_27c0.config.encryption_key.bytes[0xc] = '\0';
  fStack_27c0.config.encryption_key.bytes[0xd] = '\x04';
  fStack_27c0.config.encryption_key.bytes[0xe] = '\0';
  fStack_27c0.config.encryption_key.bytes[0xf] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x10] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x11] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x12] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x13] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_27c0.config._180_4_ = 1;
  fStack_27c0.config.block_reusing_threshold._7_1_ = 0;
  pfStack_2b18 = (fdb_iterator *)0x113ca0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar12 = (fdb_kvs_handle *)(auStack_2af8 + 0x10);
  pfStack_2b18 = (fdb_iterator *)0x113cb7;
  fVar5 = fdb_open((fdb_file_handle **)pfVar12,"./mvcc_test1",(fdb_config *)pfVar14);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar5;
  pfStack_2b18 = (fdb_iterator *)0x113cc9;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2af8._16_8_,&pfStack_2b08,(fdb_kvs_config *)config_00);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_2b18 = (fdb_iterator *)0x113ce2;
    fVar5 = fdb_snapshot_open(pfStack_2b08,(fdb_kvs_handle **)(auStack_2af8 + 8),0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011469d;
    pfStack_2b18 = (fdb_iterator *)0x113cfc;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_2af8._8_8_,(fdb_kvs_info *)(apfStack_2a48 + 6));
    if ((fdb_kvs_handle *)fStack_2a18.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_2b18 = (fdb_iterator *)0x113d0f;
      snapshot_clone_test();
    }
    pfVar12 = (fdb_kvs_handle *)auStack_2af8;
    pfStack_2b18 = (fdb_iterator *)0x113d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_2af8._8_8_,(fdb_iterator **)pfVar12,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_2b18 = (fdb_iterator *)0x113d3a;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2af8._0_8_);
    pfVar15 = pfVar23;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_001146a2;
    pfStack_2b18 = (fdb_iterator *)0x113d4d;
    fdb_iterator_close((fdb_iterator *)auStack_2af8._0_8_);
    pfStack_2b18 = (fdb_iterator *)0x113d57;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2af8._8_8_);
    lVar18 = 0;
    uVar24 = 0;
    do {
      pfStack_2b18 = (fdb_iterator *)0x113d79;
      sprintf(auStack_29d8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113d95;
      sprintf((char *)&fStack_28c0,"meta%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113db1;
      sprintf((char *)&fStack_27c0,"body%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113dc1;
      sVar8 = strlen(auStack_29d8 + 0x18);
      pfStack_2b18 = (fdb_iterator *)0x113dcc;
      sVar9 = strlen((char *)&fStack_28c0);
      pfStack_2b18 = (fdb_iterator *)0x113dd7;
      sVar10 = strlen((char *)&fStack_27c0);
      pfStack_2b18 = (fdb_iterator *)0x113dfc;
      fdb_doc_create((fdb_doc **)(auStack_2ac0 + lVar18),auStack_29d8 + 0x18,sVar8,&fStack_28c0,
                     sVar9,&fStack_27c0,sVar10);
      pfStack_2b18 = (fdb_iterator *)0x113e0b;
      fdb_set(pfStack_2b08,*(fdb_doc **)(auStack_2ac0 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar24 != 5);
    pfStack_2b18 = (fdb_iterator *)0x113e2b;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\x01');
    uVar24 = 5;
    ppfVar26 = (fdb_doc **)(auStack_2ac0 + 0x28);
    do {
      pfStack_2b18 = (fdb_iterator *)0x113e52;
      sprintf(auStack_29d8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113e6e;
      sprintf((char *)&fStack_28c0,"meta%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113e8a;
      sprintf((char *)&fStack_27c0,"body%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113e92;
      sVar8 = strlen(auStack_29d8 + 0x18);
      pfStack_2b18 = (fdb_iterator *)0x113e9d;
      sVar9 = strlen((char *)&fStack_28c0);
      pfStack_2b18 = (fdb_iterator *)0x113ea8;
      sVar10 = strlen((char *)&fStack_27c0);
      pfStack_2b18 = (fdb_iterator *)0x113ec8;
      fdb_doc_create(ppfVar26,auStack_29d8 + 0x18,sVar8,&fStack_28c0,sVar9,&fStack_27c0,sVar10);
      pfStack_2b18 = (fdb_iterator *)0x113ed5;
      fdb_set(pfStack_2b08,*ppfVar26);
      uVar24 = uVar24 + 1;
      ppfVar26 = ppfVar26 + 1;
    } while (uVar24 != 9);
    pfVar14 = (fdb_kvs_handle *)(auStack_29d8 + 0x18);
    pfStack_2b18 = (fdb_iterator *)0x113f04;
    sprintf((char *)pfVar14,"key%d",9);
    config_00 = &fStack_28c0;
    pfStack_2b18 = (fdb_iterator *)0x113f22;
    sprintf((char *)config_00,"meta%d",9);
    pfVar15 = &fStack_27c0;
    pfStack_2b18 = (fdb_iterator *)0x113f40;
    sprintf((char *)pfVar15,"Body%d",9);
    pfVar12 = (fdb_kvs_handle *)(auStack_2ac0 + 0x48);
    pfStack_2b18 = (fdb_iterator *)0x113f50;
    pfVar17 = (fdb_kvs_handle *)strlen((char *)pfVar14);
    pfStack_2b18 = (fdb_iterator *)0x113f5b;
    doc_00 = (fdb_iterator *)strlen((char *)config_00);
    pfStack_2b18 = (fdb_iterator *)0x113f66;
    sVar8 = strlen((char *)pfVar15);
    pfStack_2b18 = (fdb_iterator *)0x113f81;
    fdb_doc_create((fdb_doc **)pfVar12,pfVar14,(size_t)pfVar17,config_00,(size_t)doc_00,pfVar15,
                   sVar8);
    pfStack_2b18 = (fdb_iterator *)0x113f8e;
    fdb_set(pfStack_2b08,(fdb_doc *)auStack_2ac0._72_8_);
    pfStack_2b18 = (fdb_iterator *)0x113f9a;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\0');
    **(undefined1 **)(auStack_2ac0._72_8_ + 0x40) = 0x62;
    pfStack_2b18 = (fdb_iterator *)0x113fb1;
    fdb_set(pfStack_2b08,(fdb_doc *)auStack_2ac0._72_8_);
    pfStack_2b18 = (fdb_iterator *)0x113fbd;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\0');
    pfStack_2ad8 = *(fdb_kvs_handle **)(auStack_2ac0._72_8_ + 0x28);
    pfStack_2b18 = (fdb_iterator *)0x113fdf;
    fVar5 = fdb_snapshot_open(pfStack_2b08,&pfStack_2ac8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146a7;
    pfStack_2b18 = (fdb_iterator *)0x113ff9;
    fdb_set(pfStack_2b08,(fdb_doc *)auStack_2ac0._72_8_);
    pfStack_2b18 = (fdb_iterator *)0x114005;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\0');
    uVar24 = 10;
    pfVar12 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_2b18 = (fdb_iterator *)0x11402c;
      sprintf(auStack_29d8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x114048;
      sprintf((char *)&fStack_28c0,"meta%d",uVar24 & 0xffffffff);
      pfVar15 = &fStack_27c0;
      pfStack_2b18 = (fdb_iterator *)0x114064;
      sprintf((char *)pfVar15,"body%d",uVar24 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_2ac0 + (long)pfVar12);
      pfStack_2b18 = (fdb_iterator *)0x114074;
      pfVar14 = (fdb_kvs_handle *)strlen(auStack_29d8 + 0x18);
      pfStack_2b18 = (fdb_iterator *)0x11407f;
      pfVar17 = (fdb_kvs_handle *)strlen((char *)&fStack_28c0);
      pfStack_2b18 = (fdb_iterator *)0x11408a;
      sVar8 = strlen((char *)pfVar15);
      pfStack_2b18 = (fdb_iterator *)0x1140af;
      fdb_doc_create((fdb_doc **)doc_00,auStack_29d8 + 0x18,(size_t)pfVar14,&fStack_28c0,
                     (size_t)pfVar17,pfVar15,sVar8);
      pfStack_2b18 = (fdb_iterator *)0x1140be;
      fdb_set(pfStack_2b08,*(fdb_doc **)(auStack_2ac0 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      pfVar12 = (fdb_kvs_handle *)((long)pfVar12 + 8);
    } while (uVar24 != 0xf);
    pfStack_2b18 = (fdb_iterator *)0x1140de;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\x01');
    pfStack_2b18 = (fdb_iterator *)0x1140f6;
    fVar5 = fdb_set_log_callback(pfStack_2b08,logCallbackFunc,"snapshot_clone_test");
    config_00 = (fdb_iterator *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146ac;
    pfStack_2b18 = (fdb_iterator *)0x114112;
    fVar5 = fdb_snapshot_open(pfStack_2b08,(fdb_kvs_handle **)(auStack_2af8 + 8),999999);
    pfVar14 = pfStack_2ad8;
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001146b1;
    pfStack_2b18 = (fdb_iterator *)0x114132;
    fVar5 = fdb_snapshot_open(pfStack_2b08,(fdb_kvs_handle **)(auStack_2af8 + 8),
                              (fdb_seqnum_t)pfStack_2ad8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146b6;
    pfStack_2b18 = (fdb_iterator *)0x11414c;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2af8._8_8_,&pfStack_2ae0,
                              (fdb_seqnum_t)pfVar14);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146bb;
    pfStack_2b18 = (fdb_iterator *)0x11415e;
    fVar5 = fdb_kvs_close((fdb_kvs_handle *)auStack_2af8._8_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146c0;
    pfStack_2b18 = (fdb_iterator *)0x11417b;
    fdb_get_kvs_info(pfStack_2ae0,(fdb_kvs_info *)(apfStack_2a48 + 6));
    if ((fdb_kvs_handle *)fStack_2a18.last_seqnum != pfVar14) {
      pfStack_2b18 = (fdb_iterator *)0x114191;
      snapshot_clone_test();
    }
    uVar24 = 0xf;
    config_00 = (fdb_iterator *)apfStack_2a48;
    do {
      pfStack_2b18 = (fdb_iterator *)0x1141b9;
      sprintf(auStack_29d8 + 0x18,"key%d",uVar24 & 0xffffffff);
      doc_00 = &fStack_28c0;
      pfStack_2b18 = (fdb_iterator *)0x1141d4;
      sprintf((char *)doc_00,"meta%d",uVar24 & 0xffffffff);
      pfVar14 = &fStack_27c0;
      pfStack_2b18 = (fdb_iterator *)0x1141ef;
      sprintf((char *)pfVar14,"body%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x1141f7;
      pfVar15 = (fdb_kvs_handle *)strlen(auStack_29d8 + 0x18);
      pfStack_2b18 = (fdb_iterator *)0x114202;
      pfVar17 = (fdb_kvs_handle *)strlen((char *)doc_00);
      pfStack_2b18 = (fdb_iterator *)0x11420d;
      sVar8 = strlen((char *)pfVar14);
      pfStack_2b18 = (fdb_iterator *)0x11422d;
      fdb_doc_create((fdb_doc **)config_00,auStack_29d8 + 0x18,(size_t)pfVar15,doc_00,
                     (size_t)pfVar17,pfVar14,sVar8);
      pfStack_2b18 = (fdb_iterator *)0x11423a;
      fdb_set(pfStack_2b08,*(fdb_doc **)config_00);
      uVar24 = uVar24 + 1;
      config_00 = (fdb_iterator *)((long)config_00 + 8);
    } while (uVar24 != 0x14);
    pfStack_2b18 = (fdb_iterator *)0x114257;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\0');
    pfStack_2b18 = (fdb_iterator *)0x11426d;
    fVar5 = fdb_snapshot_open(pfStack_2ac8,&pfStack_2ad0,0xffffffffffffffff);
    pfVar12 = (fdb_kvs_handle *)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146c5;
    pfVar12 = (fdb_kvs_handle *)&pfStack_2b00;
    pfStack_2b18 = (fdb_iterator *)0x1142b8;
    fdb_doc_create((fdb_doc **)pfVar12,
                   (void *)(*(size_t **)
                             (auStack_2ac0 + (((long)pfStack_2ad8 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_2ac0 + (((long)pfStack_2ad8 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_2b18 = (fdb_iterator *)0x1142c5;
    fVar5 = fdb_get_metaonly(pfStack_2ae0,(fdb_doc *)pfStack_2b00);
    if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001146ca;
    pfStack_2b18 = (fdb_iterator *)0x1142db;
    fdb_doc_free((fdb_doc *)pfStack_2b00);
    pfStack_2b18 = (fdb_iterator *)0x1142ff;
    fdb_doc_create((fdb_doc **)&pfStack_2b00,*(kvs_ops_stat **)(auStack_2ac0._40_8_ + 0x20),
                   (size_t)*(fdb_kvs_handle **)(fdb_kvs_config *)auStack_2ac0._40_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_2b18 = (fdb_iterator *)0x11430c;
    fVar5 = fdb_get_metaonly(pfStack_2ae0,(fdb_doc *)pfStack_2b00);
    pfVar23 = (fdb_kvs_handle *)auStack_2ac0._40_8_;
    doc_01 = pfStack_2b00;
    pfVar12 = (fdb_kvs_handle *)&pfStack_2b00;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146cf;
    pfVar14 = (fdb_kvs_handle *)pfStack_2b00->op_stats;
    config_00 = *(fdb_iterator **)(auStack_2ac0._40_8_ + 0x20);
    pfStack_2b18 = (fdb_iterator *)0x114336;
    iVar6 = bcmp(pfVar14,config_00,(size_t)*(fdb_kvs_handle **)(fdb_kvs_config *)auStack_2ac0._40_8_
                );
    if (iVar6 != 0) goto LAB_001146d4;
    pfVar14 = (fdb_kvs_handle *)doc_01->staletree;
    config_00 = *(fdb_iterator **)((long)pfVar23 + 0x38);
    pfStack_2b18 = (fdb_iterator *)0x114357;
    iVar6 = bcmp(pfVar14,config_00,(size_t)(pfVar23->kvs_config).custom_cmp);
    if (iVar6 != 0) goto LAB_001146df;
    pfStack_2b18 = (fdb_iterator *)0x114367;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_2b18 = (fdb_iterator *)0x114388;
    fdb_doc_create((fdb_doc **)&pfStack_2b00,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b00->fhandle = (fdb_file_handle *)0x6;
    pfStack_2b18 = (fdb_iterator *)0x11439d;
    fVar5 = fdb_get_byseq(pfStack_2ae0,(fdb_doc *)pfStack_2b00);
    pfVar12 = pfStack_2b00;
    doc_01 = (fdb_kvs_handle *)&pfStack_2b00;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001146ea;
    pfVar14 = (fdb_kvs_handle *)pfStack_2b00->op_stats;
    config_00 = *(fdb_iterator **)(auStack_2ac0._40_8_ + 0x20);
    pfStack_2b18 = (fdb_iterator *)0x1143c6;
    iVar6 = bcmp(pfVar14,config_00,*(size_t *)&pfStack_2b00->kvs_config);
    pfVar23 = (fdb_kvs_handle *)auStack_2ac0._40_8_;
    if (iVar6 != 0) goto LAB_001146ef;
    pfVar14 = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
    config_00 = (fdb_iterator *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_2ac0._40_8_ + 0x40))->
                seqtree;
    pfStack_2b18 = (fdb_iterator *)0x1143e6;
    iVar6 = bcmp(pfVar14,config_00,(size_t)(pfVar12->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_001146fa;
    pfStack_2b18 = (fdb_iterator *)0x1143f6;
    fdb_doc_free((fdb_doc *)pfVar12);
    pfVar12 = (fdb_kvs_handle *)&pfStack_2b00;
    pfStack_2b00 = (fdb_kvs_handle *)0x0;
    pfVar17 = (fdb_kvs_handle *)0x0;
    pfStack_2b18 = (fdb_iterator *)0x114425;
    fdb_iterator_init(pfStack_2ae0,(fdb_iterator **)auStack_2af8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar15 = pfVar14;
    do {
      pfStack_2b18 = (fdb_iterator *)0x114432;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_2af8._0_8_,(fdb_doc **)pfVar12);
      pfVar14 = pfStack_2b00;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00114657:
        pfStack_2b18 = (fdb_iterator *)0x11465c;
        snapshot_clone_test();
        pfVar14 = pfVar15;
LAB_0011465c:
        pfStack_2b18 = (fdb_iterator *)0x114667;
        snapshot_clone_test();
LAB_00114667:
        pfStack_2b18 = (fdb_iterator *)0x114672;
        snapshot_clone_test();
        goto LAB_00114672;
      }
      config_00 = (fdb_iterator *)pfStack_2b00->op_stats;
      doc_00 = *(fdb_iterator **)(auStack_2ac0 + (long)pfVar17 * 8);
      pfVar23 = (fdb_kvs_handle *)doc_00->_seqnum;
      pfStack_2b18 = (fdb_iterator *)0x11445a;
      iVar6 = bcmp(config_00,pfVar23,*(size_t *)&pfStack_2b00->kvs_config);
      pfVar15 = pfVar14;
      if (iVar6 != 0) {
        pfStack_2b18 = (fdb_iterator *)0x114657;
        snapshot_clone_test();
        goto LAB_00114657;
      }
      config_00 = (fdb_iterator *)pfVar14->staletree;
      pfVar23 = (fdb_kvs_handle *)doc_00->tree_cursor_start;
      pfStack_2b18 = (fdb_iterator *)0x114479;
      iVar6 = bcmp(config_00,pfVar23,(size_t)(pfVar14->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_00114667;
      config_00 = (fdb_iterator *)(pfVar14->field_6).seqtree;
      pfVar23 = (fdb_kvs_handle *)doc_00->tree_cursor_prev;
      pfStack_2b18 = (fdb_iterator *)0x114498;
      iVar6 = bcmp(config_00,pfVar23,(size_t)(pfVar14->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_0011465c;
      pfStack_2b18 = (fdb_iterator *)0x1144a8;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_2b00 = (fdb_kvs_handle *)0x0;
      pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
      pfStack_2b18 = (fdb_iterator *)0x1144be;
      pfVar22 = (fdb_iterator *)auStack_2af8._0_8_;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2af8._0_8_);
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)pfVar17 == 10) {
      pfStack_2b18 = (fdb_iterator *)0x1144dd;
      fdb_iterator_close((fdb_iterator *)auStack_2af8._0_8_);
      pfVar17 = (fdb_kvs_handle *)0x0;
      pfStack_2b18 = (fdb_iterator *)0x1144fe;
      fdb_iterator_init(pfStack_2ad0,(fdb_iterator **)auStack_2af8,(void *)0x0,0,(void *)0x0,0,0);
      pfVar12 = (fdb_kvs_handle *)&pfStack_2b00;
      do {
        pfStack_2b18 = (fdb_iterator *)0x114510;
        fVar5 = fdb_iterator_get((fdb_iterator *)auStack_2af8._0_8_,(fdb_doc **)pfVar12);
        pfVar14 = pfStack_2b00;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011467d;
        config_00 = (fdb_iterator *)pfStack_2b00->op_stats;
        doc_00 = *(fdb_iterator **)(auStack_2ac0 + (long)pfVar17 * 8);
        pfVar23 = (fdb_kvs_handle *)doc_00->_seqnum;
        pfStack_2b18 = (fdb_iterator *)0x114538;
        iVar6 = bcmp(config_00,pfVar23,*(size_t *)&pfStack_2b00->kvs_config);
        if (iVar6 != 0) goto LAB_00114672;
        config_00 = (fdb_iterator *)pfVar14->staletree;
        pfVar23 = (fdb_kvs_handle *)doc_00->tree_cursor_start;
        pfStack_2b18 = (fdb_iterator *)0x114557;
        iVar6 = bcmp(config_00,pfVar23,(size_t)(pfVar14->kvs_config).custom_cmp);
        if (iVar6 != 0) goto LAB_0011468d;
        config_00 = (fdb_iterator *)(pfVar14->field_6).seqtree;
        pfVar23 = (fdb_kvs_handle *)doc_00->tree_cursor_prev;
        pfStack_2b18 = (fdb_iterator *)0x114576;
        iVar6 = bcmp(config_00,pfVar23,(size_t)(pfVar14->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00114682;
        pfStack_2b18 = (fdb_iterator *)0x114586;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_2b00 = (fdb_kvs_handle *)0x0;
        pfVar17 = (fdb_kvs_handle *)&(pfVar17->kvs_config).field_0x1;
        pfStack_2b18 = (fdb_iterator *)0x11459c;
        pfVar22 = (fdb_iterator *)auStack_2af8._0_8_;
        fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2af8._0_8_);
        pfVar15 = pfVar14;
      } while (fVar5 == FDB_RESULT_SUCCESS);
      if ((int)pfVar17 == 10) {
        pfStack_2b18 = (fdb_iterator *)0x1145b8;
        fdb_iterator_close((fdb_iterator *)auStack_2af8._0_8_);
        pfStack_2b18 = (fdb_iterator *)0x1145c2;
        fdb_kvs_close(pfStack_2b08);
        pfStack_2b18 = (fdb_iterator *)0x1145cc;
        fdb_kvs_close(pfStack_2ac8);
        pfStack_2b18 = (fdb_iterator *)0x1145d6;
        fdb_kvs_close(pfStack_2ad0);
        pfStack_2b18 = (fdb_iterator *)0x1145e0;
        fdb_kvs_close(pfStack_2ae0);
        pfStack_2b18 = (fdb_iterator *)0x1145ea;
        fdb_close((fdb_file_handle *)auStack_2af8._16_8_);
        lVar18 = 0;
        do {
          pfStack_2b18 = (fdb_iterator *)0x1145f6;
          fdb_doc_free(*(fdb_doc **)(auStack_2ac0 + lVar18 * 8));
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x14);
        pfStack_2b18 = (fdb_iterator *)0x114604;
        fdb_shutdown();
        pfStack_2b18 = (fdb_iterator *)0x114609;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pfStack_2b18 = (fdb_iterator *)0x11463a;
        fprintf(_stderr,pcVar21,"snapshot clone test");
        return;
      }
      goto LAB_0011470a;
    }
  }
  else {
LAB_00114698:
    pfStack_2b18 = (fdb_iterator *)0x11469d;
    snapshot_clone_test();
LAB_0011469d:
    pfStack_2b18 = (fdb_iterator *)0x1146a2;
    snapshot_clone_test();
    pfVar15 = pfVar23;
LAB_001146a2:
    pfStack_2b18 = (fdb_iterator *)0x1146a7;
    snapshot_clone_test();
LAB_001146a7:
    pfStack_2b18 = (fdb_iterator *)0x1146ac;
    snapshot_clone_test();
LAB_001146ac:
    pfStack_2b18 = (fdb_iterator *)0x1146b1;
    snapshot_clone_test();
LAB_001146b1:
    pfStack_2b18 = (fdb_iterator *)0x1146b6;
    snapshot_clone_test();
LAB_001146b6:
    pfStack_2b18 = (fdb_iterator *)0x1146bb;
    snapshot_clone_test();
LAB_001146bb:
    pfStack_2b18 = (fdb_iterator *)0x1146c0;
    snapshot_clone_test();
LAB_001146c0:
    pfStack_2b18 = (fdb_iterator *)0x1146c5;
    snapshot_clone_test();
LAB_001146c5:
    pfStack_2b18 = (fdb_iterator *)0x1146ca;
    snapshot_clone_test();
LAB_001146ca:
    pfStack_2b18 = (fdb_iterator *)0x1146cf;
    snapshot_clone_test();
LAB_001146cf:
    pfVar23 = pfVar15;
    doc_01 = pfVar12;
    pfStack_2b18 = (fdb_iterator *)0x1146d4;
    snapshot_clone_test();
LAB_001146d4:
    pfStack_2b18 = (fdb_iterator *)0x1146df;
    snapshot_clone_test();
LAB_001146df:
    pfStack_2b18 = (fdb_iterator *)0x1146ea;
    snapshot_clone_test();
LAB_001146ea:
    pfVar12 = doc_01;
    pfStack_2b18 = (fdb_iterator *)0x1146ef;
    snapshot_clone_test();
LAB_001146ef:
    pfStack_2b18 = (fdb_iterator *)0x1146fa;
    snapshot_clone_test();
LAB_001146fa:
    pfStack_2b18 = (fdb_iterator *)0x114705;
    pfVar22 = config_00;
    snapshot_clone_test();
  }
  pfStack_2b18 = (fdb_iterator *)0x11470a;
  snapshot_clone_test();
LAB_0011470a:
  pfStack_2b18 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_2b70 = (fdb_doc *)0x0;
  lVar18 = (((atomic<unsigned_long> *)&pfVar22->handle)->super___atomic_base<unsigned_long>)._M_i;
  iVar6 = *(int *)&(((atomic<unsigned_long> *)&pfVar22->seqtree_iterator)->
                   super___atomic_base<unsigned_long>)._M_i;
  pfStack_2b40 = pfVar12;
  pfStack_2b38 = pfVar23;
  pfStack_2b30 = pfVar17;
  pfStack_2b28 = pfVar14;
  pfStack_2b20 = config_00;
  pfStack_2b18 = doc_00;
  gettimeofday(&tStack_2b50,(__timezone_ptr_t)0x0);
  fVar5 = fdb_snapshot_open((fdb_kvs_handle *)
                            (((atomic<unsigned_long> *)&pfVar22->hbtrie_iterator)->
                            super___atomic_base<unsigned_long>)._M_i,&pfStack_2b58,
                            0xffffffffffffffff);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar20 = 0;
  iStack_2b5c = iVar6;
  fdb_iterator_init(pfStack_2b58,&pfStack_2b68,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar5 = fdb_iterator_get(pfStack_2b68,&pfStack_2b70);
    pfVar25 = pfStack_2b70;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_2b70->key;
    lVar2 = *(long *)(lVar18 + lVar20 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar6 = bcmp(pvVar1,pvVar3,pfStack_2b70->keylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfVar25->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar6 = bcmp(pvVar1,pvVar3,pfVar25->bodylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(pfVar25);
    pfStack_2b70 = (fdb_doc *)0x0;
    lVar20 = lVar20 + 1;
    fVar5 = fdb_iterator_next(pfStack_2b68);
  } while (fVar5 == FDB_RESULT_SUCCESS);
  if (iStack_2b5c / 2 == (int)lVar20) {
    fdb_iterator_close(pfStack_2b68);
    fdb_kvs_close(pfStack_2b58);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void crash_recovery_test(bool walflush)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_file_info file_info;
    uint64_t bid;
    const char *test_file = "./mvcc_test2";
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // reopen db
    fdb_open(&dbfile, test_file, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "crash_recovery_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    if(walflush){
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    bid = file_info.file_size / fconfig.blocksize;

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // Shutdown forest db in the middle of the test to simulate crash
    fdb_shutdown();

    // append 9K of non-block aligned garbage at end of file
    r = _disk_dump(test_file, bid * fconfig.blocksize,
                   (2 * fconfig.blocksize) + (fconfig.blocksize / 4));
    TEST_CHK(r >= 0);

    // reopen the same file
    status = fdb_open(&dbfile, test_file, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "crash_recovery_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
    }

    // retrieve documents by sequence number
    for (i=0;i<n;++i){
        // search by seq
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->seqnum = i + 1;
        status = fdb_get_byseq(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // free result document
        fdb_doc_free(rdoc);
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    if(walflush){
        TEST_RESULT("crash recovery test - walflush");
    } else {
        TEST_RESULT("crash recovery test - normal flush");
    }
}